

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_rgb.c
# Opt level: O2

void yuv420_rgb24_sseu(uint32_t width,uint32_t height,uint8_t *Y,uint8_t *U,uint8_t *V,
                      uint32_t Y_stride,uint32_t UV_stride,uint8_t *RGB,uint32_t RGB_stride,
                      YCbCrType yuv_type)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  byte bVar3;
  byte bVar11;
  byte bVar19;
  byte bVar27;
  byte bVar35;
  byte bVar43;
  byte bVar51;
  byte bVar59;
  byte bVar67;
  byte bVar75;
  byte bVar83;
  byte bVar91;
  byte bVar99;
  byte bVar107;
  byte bVar115;
  byte bVar123;
  char cVar125;
  int iVar126;
  int iVar127;
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [15];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  unkbyte10 Var155;
  undefined1 auVar156 [12];
  undefined1 auVar157 [14];
  unkbyte10 Var158;
  undefined1 auVar159 [12];
  undefined1 auVar160 [14];
  unkbyte10 Var161;
  undefined1 auVar162 [12];
  undefined1 auVar163 [14];
  undefined1 auVar164 [15];
  unkuint9 Var165;
  undefined1 auVar166 [11];
  undefined1 auVar167 [15];
  undefined1 auVar168 [11];
  undefined1 auVar169 [15];
  undefined1 auVar170 [11];
  undefined1 auVar171 [15];
  undefined1 auVar172 [11];
  undefined1 auVar173 [13];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  ulong uVar182;
  uint8_t *puVar183;
  long lVar184;
  ulong uVar185;
  uint uVar186;
  uint uVar187;
  ulong uVar188;
  short sVar189;
  short sVar214;
  undefined4 uVar190;
  undefined4 uVar191;
  short sVar218;
  undefined1 auVar197 [12];
  undefined1 auVar198 [12];
  undefined1 auVar200 [12];
  undefined1 auVar201 [12];
  short sVar215;
  short sVar216;
  short sVar217;
  short sVar219;
  undefined1 auVar208 [16];
  short sVar220;
  short sVar221;
  undefined4 uVar222;
  undefined1 auVar226 [12];
  undefined1 auVar227 [12];
  undefined1 auVar228 [12];
  undefined1 auVar229 [12];
  undefined1 auVar230 [12];
  short sVar244;
  short sVar245;
  short sVar246;
  undefined1 auVar237 [16];
  short sVar247;
  undefined4 uVar248;
  undefined4 uVar249;
  short sVar272;
  short sVar273;
  short sVar274;
  short sVar275;
  short sVar276;
  undefined1 auVar254 [12];
  undefined1 auVar256 [12];
  undefined1 auVar258 [12];
  undefined1 auVar259 [12];
  short sVar277;
  short sVar278;
  ushort uVar279;
  ushort uVar313;
  undefined4 uVar280;
  undefined1 auVar283 [12];
  undefined1 auVar284 [12];
  undefined1 auVar285 [12];
  ushort uVar317;
  undefined1 auVar287 [12];
  undefined1 auVar288 [12];
  ushort uVar314;
  ushort uVar315;
  ushort uVar316;
  ushort uVar318;
  undefined1 in_XMM3 [16];
  undefined1 auVar295 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  ushort uVar319;
  ushort uVar320;
  short sVar321;
  short sVar322;
  ushort uVar332;
  short sVar333;
  ushort uVar334;
  short sVar335;
  short sVar336;
  ushort uVar337;
  short sVar338;
  ushort uVar339;
  short sVar340;
  ushort uVar341;
  short sVar342;
  undefined1 auVar323 [12];
  undefined1 auVar324 [12];
  undefined1 auVar325 [12];
  ushort uVar343;
  short sVar344;
  ushort uVar345;
  short sVar346;
  short sVar347;
  short sVar348;
  short sVar349;
  short sVar362;
  undefined1 auVar350 [12];
  undefined1 auVar351 [12];
  short sVar358;
  short sVar359;
  short sVar360;
  short sVar361;
  short sVar363;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  short sVar364;
  undefined4 uVar365;
  undefined1 auVar369 [12];
  undefined1 auVar370 [12];
  undefined1 in_XMM6 [16];
  undefined1 auVar374 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  short sVar387;
  undefined4 uVar388;
  short sVar407;
  short sVar408;
  undefined1 auVar391 [12];
  undefined1 auVar392 [12];
  undefined1 auVar393 [12];
  undefined1 auVar395 [12];
  short sVar409;
  undefined1 auVar403 [16];
  ushort uVar410;
  short sVar411;
  ushort uVar412;
  ushort uVar433;
  undefined4 uVar413;
  ushort uVar431;
  short sVar432;
  ushort uVar434;
  short sVar435;
  ushort uVar436;
  ushort uVar437;
  short sVar438;
  ushort uVar439;
  ushort uVar440;
  short sVar441;
  ushort uVar442;
  ushort uVar443;
  short sVar444;
  undefined1 auVar416 [12];
  undefined1 auVar417 [12];
  undefined1 auVar418 [12];
  undefined1 auVar419 [12];
  ushort uVar445;
  ushort uVar446;
  short sVar447;
  ushort uVar448;
  ushort uVar449;
  short sVar450;
  ushort uVar451;
  short sVar452;
  undefined4 uVar453;
  short sVar463;
  undefined1 auVar456 [12];
  undefined1 auVar462 [16];
  short sVar464;
  ushort uVar465;
  short sVar481;
  short sVar483;
  short sVar485;
  short sVar487;
  short sVar489;
  undefined1 auVar466 [12];
  undefined1 auVar467 [12];
  undefined1 auVar468 [12];
  undefined1 auVar469 [12];
  ushort uVar482;
  ushort uVar484;
  ushort uVar486;
  ushort uVar488;
  ushort uVar490;
  undefined1 auVar470 [12];
  short sVar491;
  ushort uVar492;
  short sVar493;
  ushort uVar494;
  short sVar495;
  undefined1 auVar496 [12];
  short sVar504;
  undefined1 auVar500 [16];
  undefined1 auVar497 [12];
  undefined1 auVar503 [16];
  short sVar505;
  short sVar506;
  ushort uVar507;
  undefined4 uVar508;
  ushort uVar523;
  ushort uVar524;
  ushort uVar525;
  ushort uVar526;
  undefined1 auVar511 [12];
  undefined1 auVar513 [12];
  undefined1 auVar514 [12];
  ushort uVar527;
  ushort uVar528;
  ushort uVar529;
  short sVar530;
  short sVar537;
  undefined4 uVar531;
  short sVar538;
  short sVar539;
  short sVar540;
  short sVar541;
  short sVar542;
  short sVar543;
  undefined1 auVar544 [12];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar76;
  char cVar77;
  char cVar78;
  char cVar79;
  char cVar80;
  char cVar81;
  char cVar82;
  char cVar84;
  char cVar85;
  char cVar86;
  char cVar87;
  char cVar88;
  char cVar89;
  char cVar90;
  char cVar92;
  char cVar93;
  char cVar94;
  char cVar95;
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar100;
  char cVar101;
  char cVar102;
  char cVar103;
  char cVar104;
  char cVar105;
  char cVar106;
  char cVar108;
  char cVar109;
  char cVar110;
  char cVar111;
  char cVar112;
  char cVar113;
  char cVar114;
  char cVar116;
  char cVar117;
  char cVar118;
  char cVar119;
  char cVar120;
  char cVar121;
  char cVar122;
  char cVar124;
  undefined6 uVar192;
  undefined6 uVar193;
  undefined8 uVar194;
  undefined8 uVar195;
  undefined1 auVar196 [12];
  undefined1 auVar199 [12];
  undefined1 auVar202 [14];
  undefined1 auVar203 [14];
  undefined1 auVar204 [14];
  undefined1 auVar205 [14];
  undefined1 auVar206 [14];
  undefined1 auVar207 [14];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined6 uVar223;
  undefined8 uVar224;
  undefined1 auVar225 [12];
  undefined1 auVar231 [14];
  undefined1 auVar232 [14];
  undefined1 auVar233 [14];
  undefined1 auVar234 [14];
  undefined1 auVar235 [14];
  undefined1 auVar236 [14];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined6 uVar250;
  undefined6 uVar251;
  undefined8 uVar252;
  undefined8 uVar253;
  undefined1 auVar255 [12];
  undefined1 auVar257 [12];
  undefined1 auVar260 [14];
  undefined1 auVar261 [14];
  undefined1 auVar262 [14];
  undefined1 auVar263 [14];
  undefined1 auVar264 [14];
  undefined1 auVar265 [14];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined6 uVar281;
  undefined1 auVar296 [16];
  undefined8 uVar282;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar286 [12];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar289 [14];
  undefined1 auVar290 [14];
  undefined1 auVar291 [14];
  undefined1 auVar292 [14];
  undefined1 auVar293 [14];
  undefined1 auVar294 [14];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar326 [14];
  undefined1 auVar327 [14];
  undefined1 auVar328 [14];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar352 [14];
  undefined1 auVar353 [14];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined6 uVar366;
  undefined1 auVar375 [16];
  undefined8 uVar367;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar368 [12];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar371 [14];
  undefined1 auVar372 [14];
  undefined1 auVar373 [14];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined6 uVar389;
  undefined8 uVar390;
  undefined1 auVar394 [12];
  undefined1 auVar396 [14];
  undefined1 auVar397 [14];
  undefined1 auVar398 [14];
  undefined1 auVar399 [14];
  undefined1 auVar400 [14];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined6 uVar414;
  undefined8 uVar415;
  undefined1 auVar420 [12];
  undefined1 auVar421 [14];
  undefined1 auVar422 [14];
  undefined1 auVar423 [14];
  undefined1 auVar424 [14];
  undefined1 auVar425 [14];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined6 uVar454;
  undefined8 uVar455;
  undefined1 auVar457 [12];
  undefined1 auVar458 [14];
  undefined1 auVar459 [14];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar471 [14];
  undefined1 auVar472 [14];
  undefined1 auVar473 [14];
  undefined1 auVar474 [14];
  undefined1 auVar475 [14];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar498 [14];
  undefined1 auVar499 [14];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined6 uVar509;
  undefined8 uVar510;
  undefined1 auVar512 [12];
  undefined1 auVar515 [14];
  undefined1 auVar516 [14];
  undefined1 auVar517 [14];
  undefined1 auVar518 [14];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined6 uVar532;
  undefined8 uVar533;
  undefined1 auVar534 [12];
  undefined1 auVar535 [14];
  undefined1 auVar536 [16];
  undefined1 auVar545 [14];
  undefined1 auVar546 [16];
  
  uVar182 = (ulong)yuv_type;
  iVar127 = RGB_stride * 2;
  iVar126 = Y_stride * 2;
  uVar188 = 0;
  uVar186 = 0;
  for (uVar187 = 0; uVar187 < height - 1; uVar187 = uVar187 + 2) {
    uVar185 = (ulong)((uVar187 >> 1) * UV_stride);
    puVar183 = RGB;
    for (lVar184 = 0; auVar462 = _DAT_0010a570, (uint)lVar184 < width - 0x1f;
        lVar184 = lVar184 + 0x20) {
      puVar1 = U + uVar185;
      puVar2 = V + uVar185;
      auVar381._0_14_ = in_XMM6._0_14_;
      auVar381[0xe] = in_XMM6[7];
      auVar381[0xf] = puVar1[7] ^ 0x80;
      auVar380._14_2_ = auVar381._14_2_;
      auVar380._0_13_ = in_XMM6._0_13_;
      auVar380[0xd] = puVar1[6] ^ 0x80;
      auVar379._13_3_ = auVar380._13_3_;
      auVar379._0_12_ = in_XMM6._0_12_;
      auVar379[0xc] = in_XMM6[6];
      auVar378._12_4_ = auVar379._12_4_;
      auVar378._0_11_ = in_XMM6._0_11_;
      auVar378[0xb] = puVar1[5] ^ 0x80;
      auVar377._11_5_ = auVar378._11_5_;
      auVar377._0_10_ = in_XMM6._0_10_;
      auVar377[10] = in_XMM6[5];
      auVar376._10_6_ = auVar377._10_6_;
      auVar376._0_9_ = in_XMM6._0_9_;
      auVar376[9] = puVar1[4] ^ 0x80;
      auVar375._9_7_ = auVar376._9_7_;
      auVar375._0_8_ = in_XMM6._0_8_;
      auVar375[8] = in_XMM6[4];
      auVar374._8_8_ = auVar375._8_8_;
      auVar374[7] = puVar1[3] ^ 0x80;
      auVar374[6] = in_XMM6[3];
      auVar374[5] = puVar1[2] ^ 0x80;
      auVar374[4] = in_XMM6[2];
      auVar374[3] = puVar1[1] ^ 0x80;
      auVar374[2] = in_XMM6[1];
      auVar374._0_2_ = CONCAT11(*puVar1,in_XMM6[0]) ^ 0x8000;
      auVar382 = psraw(auVar374,8);
      auVar302._0_14_ = in_XMM3._0_14_;
      auVar302[0xe] = in_XMM3[7];
      auVar302[0xf] = puVar2[7] ^ 0x80;
      auVar301._14_2_ = auVar302._14_2_;
      auVar301._0_13_ = in_XMM3._0_13_;
      auVar301[0xd] = puVar2[6] ^ 0x80;
      auVar300._13_3_ = auVar301._13_3_;
      auVar300._0_12_ = in_XMM3._0_12_;
      auVar300[0xc] = in_XMM3[6];
      auVar299._12_4_ = auVar300._12_4_;
      auVar299._0_11_ = in_XMM3._0_11_;
      auVar299[0xb] = puVar2[5] ^ 0x80;
      auVar298._11_5_ = auVar299._11_5_;
      auVar298._0_10_ = in_XMM3._0_10_;
      auVar298[10] = in_XMM3[5];
      auVar297._10_6_ = auVar298._10_6_;
      auVar297._0_9_ = in_XMM3._0_9_;
      auVar297[9] = puVar2[4] ^ 0x80;
      auVar296._9_7_ = auVar297._9_7_;
      auVar296._0_8_ = in_XMM3._0_8_;
      auVar296[8] = in_XMM3[4];
      auVar295._8_8_ = auVar296._8_8_;
      auVar295[7] = puVar2[3] ^ 0x80;
      auVar295[6] = in_XMM3[3];
      auVar295[5] = puVar2[2] ^ 0x80;
      auVar295[4] = in_XMM3[2];
      auVar295[3] = puVar2[1] ^ 0x80;
      auVar295[2] = in_XMM3[1];
      auVar295._0_2_ = CONCAT11(*puVar2,in_XMM3[0]) ^ 0x8000;
      auVar303 = psraw(auVar295,8);
      auVar208 = pshuflw(ZEXT116(YUV2RGB[uVar182].cr_factor),ZEXT116(YUV2RGB[uVar182].cr_factor),0);
      sVar495 = auVar208._0_2_;
      auVar354._0_2_ = auVar303._0_2_ * sVar495;
      sVar504 = auVar208._2_2_;
      auVar354._2_2_ = auVar303._2_2_ * sVar504;
      auVar354._4_2_ = auVar303._4_2_ * sVar495;
      auVar354._6_2_ = auVar303._6_2_ * sVar504;
      auVar354._8_2_ = auVar303._8_2_ * sVar495;
      auVar354._10_2_ = auVar303._10_2_ * sVar504;
      auVar354._12_2_ = auVar303._12_2_ * sVar495;
      auVar354._14_2_ = auVar303._14_2_ * sVar504;
      auVar355 = psraw(auVar354,6);
      auVar208 = pshuflw(ZEXT116(YUV2RGB[uVar182].g_cb_factor),ZEXT116(YUV2RGB[uVar182].g_cb_factor)
                         ,0);
      sVar322 = auVar208._0_2_;
      sVar336 = auVar208._2_2_;
      auVar208 = pshuflw(ZEXT116(YUV2RGB[uVar182].g_cr_factor),ZEXT116(YUV2RGB[uVar182].g_cr_factor)
                         ,0);
      sVar347 = auVar208._0_2_;
      sVar349 = auVar208._2_2_;
      auVar304._0_2_ = auVar303._0_2_ * sVar347 + sVar322 * auVar382._0_2_;
      auVar304._2_2_ = auVar303._2_2_ * sVar349 + sVar336 * auVar382._2_2_;
      auVar304._4_2_ = auVar303._4_2_ * sVar347 + sVar322 * auVar382._4_2_;
      auVar304._6_2_ = auVar303._6_2_ * sVar349 + sVar336 * auVar382._6_2_;
      auVar304._8_2_ = auVar303._8_2_ * sVar347 + sVar322 * auVar382._8_2_;
      auVar304._10_2_ = auVar303._10_2_ * sVar349 + sVar336 * auVar382._10_2_;
      auVar304._12_2_ = auVar303._12_2_ * sVar347 + sVar322 * auVar382._12_2_;
      auVar304._14_2_ = auVar303._14_2_ * sVar349 + sVar336 * auVar382._14_2_;
      auVar303 = psraw(auVar304,7);
      sVar543 = auVar355._6_2_;
      sVar541 = auVar355._4_2_;
      sVar539 = auVar355._2_2_;
      sVar537 = auVar355._0_2_;
      sVar346 = auVar303._6_2_;
      sVar342 = auVar303._4_2_;
      sVar338 = auVar303._2_2_;
      sVar333 = auVar303._0_2_;
      sVar358 = auVar355._8_2_;
      sVar360 = auVar355._10_2_;
      sVar362 = auVar355._12_2_;
      sVar364 = auVar355._14_2_;
      sVar214 = auVar303._8_2_;
      sVar216 = auVar303._10_2_;
      sVar218 = auVar303._12_2_;
      sVar220 = auVar303._14_2_;
      auVar208 = ZEXT216(CONCAT11(YUV2RGB[uVar182].y_offset,YUV2RGB[uVar182].y_offset));
      auVar208 = pshuflw(auVar208,auVar208,0);
      uVar190 = auVar208._0_4_;
      auVar237._4_4_ = uVar190;
      auVar237._0_4_ = uVar190;
      auVar237._8_4_ = uVar190;
      auVar237._12_4_ = uVar190;
      auVar355 = psubusb(*(undefined1 (*) [16])(Y + lVar184 + uVar188),auVar237);
      auVar128[0xd] = 0;
      auVar128._0_13_ = auVar355._0_13_;
      auVar128[0xe] = auVar355[7];
      auVar131[0xc] = auVar355[6];
      auVar131._0_12_ = auVar355._0_12_;
      auVar131._13_2_ = auVar128._13_2_;
      auVar135[0xb] = 0;
      auVar135._0_11_ = auVar355._0_11_;
      auVar135._12_3_ = auVar131._12_3_;
      auVar139[10] = auVar355[5];
      auVar139._0_10_ = auVar355._0_10_;
      auVar139._11_4_ = auVar135._11_4_;
      auVar143[9] = 0;
      auVar143._0_9_ = auVar355._0_9_;
      auVar143._10_5_ = auVar139._10_5_;
      auVar147[8] = auVar355[4];
      auVar147._0_8_ = auVar355._0_8_;
      auVar147._9_6_ = auVar143._9_6_;
      auVar164._7_8_ = 0;
      auVar164._0_7_ = auVar147._8_7_;
      Var165 = CONCAT81(SUB158(auVar164 << 0x40,7),auVar355[3]);
      auVar174._9_6_ = 0;
      auVar174._0_9_ = Var165;
      auVar166._1_10_ = SUB1510(auVar174 << 0x30,5);
      auVar166[0] = auVar355[2];
      auVar175._11_4_ = 0;
      auVar175._0_11_ = auVar166;
      auVar152[2] = auVar355[1];
      auVar152._0_2_ = auVar355._0_2_;
      auVar152._3_12_ = SUB1512(auVar175 << 0x20,3);
      auVar208 = pshuflw(ZEXT116(YUV2RGB[uVar182].y_factor),ZEXT116(YUV2RGB[uVar182].y_factor),0);
      sVar505 = auVar208._0_2_;
      sVar506 = auVar208._2_2_;
      uVar410 = (ushort)((auVar355._0_2_ & 0xff) * sVar505) >> 7;
      uVar431 = (ushort)(auVar152._2_2_ * sVar506) >> 7;
      uVar434 = (ushort)(auVar166._0_2_ * sVar505) >> 7;
      uVar437 = (ushort)((short)Var165 * sVar506) >> 7;
      uVar440 = (ushort)(auVar147._8_2_ * sVar505) >> 7;
      uVar443 = (ushort)(auVar139._10_2_ * sVar506) >> 7;
      uVar446 = (ushort)(auVar131._12_2_ * sVar505) >> 7;
      uVar449 = (ushort)((auVar128._13_2_ >> 8) * sVar506) >> 7;
      uVar320 = (ushort)((ushort)auVar355[8] * sVar505) >> 7;
      uVar332 = (ushort)((ushort)auVar355[9] * sVar506) >> 7;
      uVar334 = (ushort)((ushort)auVar355[10] * sVar505) >> 7;
      uVar337 = (ushort)((ushort)auVar355[0xb] * sVar506) >> 7;
      uVar339 = (ushort)((ushort)auVar355[0xc] * sVar505) >> 7;
      uVar341 = (ushort)((ushort)auVar355[0xd] * sVar506) >> 7;
      uVar343 = (ushort)((ushort)auVar355[0xe] * sVar505) >> 7;
      uVar345 = (ushort)((ushort)auVar355[0xf] * sVar506) >> 7;
      sVar464 = uVar410 + sVar537;
      sVar481 = uVar431 + sVar537;
      sVar483 = uVar434 + sVar539;
      sVar485 = uVar437 + sVar539;
      sVar487 = uVar440 + sVar541;
      sVar489 = uVar443 + sVar541;
      sVar491 = uVar446 + sVar543;
      sVar493 = uVar449 + sVar543;
      sVar247 = uVar320 + sVar358;
      sVar272 = uVar332 + sVar358;
      sVar273 = uVar334 + sVar360;
      sVar274 = uVar337 + sVar360;
      sVar275 = uVar339 + sVar362;
      sVar276 = uVar341 + sVar362;
      sVar277 = uVar343 + sVar364;
      sVar278 = uVar345 + sVar364;
      bVar3 = (0 < sVar481) * (sVar481 < 0x100) * (char)sVar481 - (0xff < sVar481);
      cVar4 = (0 < sVar485) * (sVar485 < 0x100) * (char)sVar485 - (0xff < sVar485);
      uVar413 = CONCAT13(cVar4,CONCAT12((0 < sVar483) * (sVar483 < 0x100) * (char)sVar483 -
                                        (0xff < sVar483),
                                        CONCAT11(bVar3,(0 < sVar464) * (sVar464 < 0x100) *
                                                       (char)sVar464 - (0xff < sVar464))));
      cVar5 = (0 < sVar489) * (sVar489 < 0x100) * (char)sVar489 - (0xff < sVar489);
      uVar414 = CONCAT15(cVar5,CONCAT14((0 < sVar487) * (sVar487 < 0x100) * (char)sVar487 -
                                        (0xff < sVar487),uVar413));
      cVar6 = (0 < sVar493) * (sVar493 < 0x100) * (char)sVar493 - (0xff < sVar493);
      uVar415 = CONCAT17(cVar6,CONCAT16((0 < sVar491) * (sVar491 < 0x100) * (char)sVar491 -
                                        (0xff < sVar491),uVar414));
      cVar7 = (0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 - (0xff < sVar272);
      auVar466._0_10_ =
           CONCAT19(cVar7,CONCAT18((0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 -
                                   (0xff < sVar247),uVar415));
      auVar466[10] = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      cVar8 = (0 < sVar274) * (sVar274 < 0x100) * (char)sVar274 - (0xff < sVar274);
      auVar466[0xb] = cVar8;
      auVar471[0xc] = (0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 - (0xff < sVar275);
      auVar471._0_12_ = auVar466;
      cVar9 = (0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 - (0xff < sVar276);
      auVar471[0xd] = cVar9;
      auVar476[0xe] = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
      auVar476._0_14_ = auVar471;
      cVar10 = (0 < sVar278) * (sVar278 < 0x100) * (char)sVar278 - (0xff < sVar278);
      auVar476[0xf] = cVar10;
      sVar464 = uVar410 - sVar333;
      sVar481 = uVar431 - sVar333;
      sVar483 = uVar434 - sVar338;
      sVar485 = uVar437 - sVar338;
      sVar487 = uVar440 - sVar342;
      sVar489 = uVar443 - sVar342;
      sVar491 = uVar446 - sVar346;
      sVar493 = uVar449 - sVar346;
      sVar247 = uVar320 - sVar214;
      sVar272 = uVar332 - sVar214;
      sVar273 = uVar334 - sVar216;
      sVar274 = uVar337 - sVar216;
      sVar275 = uVar339 - sVar218;
      sVar276 = uVar341 - sVar218;
      sVar277 = uVar343 - sVar220;
      sVar278 = uVar345 - sVar220;
      bVar11 = (0 < sVar481) * (sVar481 < 0x100) * (char)sVar481 - (0xff < sVar481);
      cVar12 = (0 < sVar485) * (sVar485 < 0x100) * (char)sVar485 - (0xff < sVar485);
      uVar453 = CONCAT13(cVar12,CONCAT12((0 < sVar483) * (sVar483 < 0x100) * (char)sVar483 -
                                         (0xff < sVar483),
                                         CONCAT11(bVar11,(0 < sVar464) * (sVar464 < 0x100) *
                                                         (char)sVar464 - (0xff < sVar464))));
      cVar13 = (0 < sVar489) * (sVar489 < 0x100) * (char)sVar489 - (0xff < sVar489);
      uVar454 = CONCAT15(cVar13,CONCAT14((0 < sVar487) * (sVar487 < 0x100) * (char)sVar487 -
                                         (0xff < sVar487),uVar453));
      cVar14 = (0 < sVar493) * (sVar493 < 0x100) * (char)sVar493 - (0xff < sVar493);
      uVar455 = CONCAT17(cVar14,CONCAT16((0 < sVar491) * (sVar491 < 0x100) * (char)sVar491 -
                                         (0xff < sVar491),uVar454));
      cVar15 = (0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 - (0xff < sVar272);
      auVar511._0_10_ =
           CONCAT19(cVar15,CONCAT18((0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 -
                                    (0xff < sVar247),uVar455));
      auVar511[10] = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      cVar16 = (0 < sVar274) * (sVar274 < 0x100) * (char)sVar274 - (0xff < sVar274);
      auVar511[0xb] = cVar16;
      auVar515[0xc] = (0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 - (0xff < sVar275);
      auVar515._0_12_ = auVar511;
      cVar17 = (0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 - (0xff < sVar276);
      auVar515[0xd] = cVar17;
      auVar519[0xe] = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
      auVar519._0_14_ = auVar515;
      cVar18 = (0 < sVar278) * (sVar278 < 0x100) * (char)sVar278 - (0xff < sVar278);
      auVar519[0xf] = cVar18;
      auVar208 = pshuflw(ZEXT116(YUV2RGB[uVar182].cb_factor),ZEXT116(YUV2RGB[uVar182].cb_factor),0);
      sVar452 = auVar208._0_2_;
      auVar383._0_2_ = auVar382._0_2_ * sVar452;
      sVar463 = auVar208._2_2_;
      auVar383._2_2_ = auVar382._2_2_ * sVar463;
      auVar383._4_2_ = auVar382._4_2_ * sVar452;
      auVar383._6_2_ = auVar382._6_2_ * sVar463;
      auVar383._8_2_ = auVar382._8_2_ * sVar452;
      auVar383._10_2_ = auVar382._10_2_ * sVar463;
      auVar383._12_2_ = auVar382._12_2_ * sVar452;
      auVar383._14_2_ = auVar382._14_2_ * sVar463;
      auVar208 = psraw(auVar383,6);
      sVar493 = auVar208._6_2_;
      sVar491 = auVar208._4_2_;
      sVar489 = auVar208._2_2_;
      sVar487 = auVar208._0_2_;
      sVar247 = auVar208._8_2_;
      sVar272 = auVar208._10_2_;
      sVar273 = auVar208._12_2_;
      sVar274 = auVar208._14_2_;
      sVar411 = uVar410 + sVar487;
      sVar432 = uVar431 + sVar487;
      sVar435 = uVar434 + sVar489;
      sVar438 = uVar437 + sVar489;
      sVar441 = uVar440 + sVar491;
      sVar444 = uVar443 + sVar491;
      sVar447 = uVar446 + sVar493;
      sVar450 = uVar449 + sVar493;
      sVar275 = uVar320 + sVar247;
      sVar276 = uVar332 + sVar247;
      sVar277 = uVar334 + sVar272;
      sVar278 = uVar337 + sVar272;
      sVar464 = uVar339 + sVar273;
      sVar481 = uVar341 + sVar273;
      sVar483 = uVar343 + sVar274;
      sVar485 = uVar345 + sVar274;
      bVar19 = (0 < sVar432) * (sVar432 < 0x100) * (char)sVar432 - (0xff < sVar432);
      cVar20 = (0 < sVar438) * (sVar438 < 0x100) * (char)sVar438 - (0xff < sVar438);
      uVar280 = CONCAT13(cVar20,CONCAT12((0 < sVar435) * (sVar435 < 0x100) * (char)sVar435 -
                                         (0xff < sVar435),
                                         CONCAT11(bVar19,(0 < sVar411) * (sVar411 < 0x100) *
                                                         (char)sVar411 - (0xff < sVar411))));
      cVar21 = (0 < sVar444) * (sVar444 < 0x100) * (char)sVar444 - (0xff < sVar444);
      uVar281 = CONCAT15(cVar21,CONCAT14((0 < sVar441) * (sVar441 < 0x100) * (char)sVar441 -
                                         (0xff < sVar441),uVar280));
      cVar22 = (0 < sVar450) * (sVar450 < 0x100) * (char)sVar450 - (0xff < sVar450);
      uVar282 = CONCAT17(cVar22,CONCAT16((0 < sVar447) * (sVar447 < 0x100) * (char)sVar447 -
                                         (0xff < sVar447),uVar281));
      cVar23 = (0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 - (0xff < sVar276);
      auVar416._0_10_ =
           CONCAT19(cVar23,CONCAT18((0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 -
                                    (0xff < sVar275),uVar282));
      auVar416[10] = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
      cVar24 = (0 < sVar278) * (sVar278 < 0x100) * (char)sVar278 - (0xff < sVar278);
      auVar416[0xb] = cVar24;
      auVar421[0xc] = (0 < sVar464) * (sVar464 < 0x100) * (char)sVar464 - (0xff < sVar464);
      auVar421._0_12_ = auVar416;
      cVar25 = (0 < sVar481) * (sVar481 < 0x100) * (char)sVar481 - (0xff < sVar481);
      auVar421[0xd] = cVar25;
      auVar426[0xe] = (0 < sVar483) * (sVar483 < 0x100) * (char)sVar483 - (0xff < sVar483);
      auVar426._0_14_ = auVar421;
      cVar26 = (0 < sVar485) * (sVar485 < 0x100) * (char)sVar485 - (0xff < sVar485);
      auVar426[0xf] = cVar26;
      auVar208 = psubusb(*(undefined1 (*) [16])(Y + lVar184 + (ulong)Y_stride),auVar237);
      auVar129[0xd] = 0;
      auVar129._0_13_ = auVar208._0_13_;
      auVar129[0xe] = auVar208[7];
      auVar132[0xc] = auVar208[6];
      auVar132._0_12_ = auVar208._0_12_;
      auVar132._13_2_ = auVar129._13_2_;
      auVar136[0xb] = 0;
      auVar136._0_11_ = auVar208._0_11_;
      auVar136._12_3_ = auVar132._12_3_;
      auVar140[10] = auVar208[5];
      auVar140._0_10_ = auVar208._0_10_;
      auVar140._11_4_ = auVar136._11_4_;
      auVar144[9] = 0;
      auVar144._0_9_ = auVar208._0_9_;
      auVar144._10_5_ = auVar140._10_5_;
      auVar148[8] = auVar208[4];
      auVar148._0_8_ = auVar208._0_8_;
      auVar148._9_6_ = auVar144._9_6_;
      auVar167._7_8_ = 0;
      auVar167._0_7_ = auVar148._8_7_;
      Var165 = CONCAT81(SUB158(auVar167 << 0x40,7),auVar208[3]);
      auVar176._9_6_ = 0;
      auVar176._0_9_ = Var165;
      auVar168._1_10_ = SUB1510(auVar176 << 0x30,5);
      auVar168[0] = auVar208[2];
      auVar177._11_4_ = 0;
      auVar177._0_11_ = auVar168;
      auVar153[2] = auVar208[1];
      auVar153._0_2_ = auVar208._0_2_;
      auVar153._3_12_ = SUB1512(auVar177 << 0x20,3);
      uVar320 = (ushort)((auVar208._0_2_ & 0xff) * sVar505) >> 7;
      uVar332 = (ushort)(auVar153._2_2_ * sVar506) >> 7;
      uVar334 = (ushort)(auVar168._0_2_ * sVar505) >> 7;
      uVar337 = (ushort)((short)Var165 * sVar506) >> 7;
      uVar339 = (ushort)(auVar148._8_2_ * sVar505) >> 7;
      uVar341 = (ushort)(auVar140._10_2_ * sVar506) >> 7;
      uVar343 = (ushort)(auVar132._12_2_ * sVar505) >> 7;
      uVar345 = (ushort)((auVar129._13_2_ >> 8) * sVar506) >> 7;
      sVar321 = uVar320 - sVar333;
      sVar333 = uVar332 - sVar333;
      sVar335 = uVar334 - sVar338;
      sVar338 = uVar337 - sVar338;
      sVar340 = uVar339 - sVar342;
      sVar342 = uVar341 - sVar342;
      sVar344 = uVar343 - sVar346;
      sVar346 = uVar345 - sVar346;
      sVar530 = sVar537 + uVar320;
      sVar537 = sVar537 + uVar332;
      sVar538 = sVar539 + uVar334;
      sVar539 = sVar539 + uVar337;
      sVar540 = sVar541 + uVar339;
      sVar541 = sVar541 + uVar341;
      sVar542 = sVar543 + uVar343;
      sVar543 = sVar543 + uVar345;
      sVar387 = uVar320 + sVar487;
      sVar487 = uVar332 + sVar487;
      sVar407 = uVar334 + sVar489;
      sVar489 = uVar337 + sVar489;
      sVar408 = uVar339 + sVar491;
      sVar491 = uVar341 + sVar491;
      sVar409 = uVar343 + sVar493;
      sVar493 = uVar345 + sVar493;
      uVar320 = (ushort)((ushort)auVar208[8] * sVar505) >> 7;
      uVar332 = (ushort)((ushort)auVar208[9] * sVar506) >> 7;
      uVar334 = (ushort)((ushort)auVar208[10] * sVar505) >> 7;
      uVar337 = (ushort)((ushort)auVar208[0xb] * sVar506) >> 7;
      uVar339 = (ushort)((ushort)auVar208[0xc] * sVar505) >> 7;
      uVar341 = (ushort)((ushort)auVar208[0xd] * sVar506) >> 7;
      uVar343 = (ushort)((ushort)auVar208[0xe] * sVar505) >> 7;
      uVar345 = (ushort)((ushort)auVar208[0xf] * sVar506) >> 7;
      sVar348 = sVar358 + uVar320;
      sVar358 = sVar358 + uVar332;
      sVar359 = sVar360 + uVar334;
      sVar360 = sVar360 + uVar337;
      sVar361 = sVar362 + uVar339;
      sVar362 = sVar362 + uVar341;
      sVar363 = sVar364 + uVar343;
      sVar364 = sVar364 + uVar345;
      bVar27 = (0 < sVar537) * (sVar537 < 0x100) * (char)sVar537 - (0xff < sVar537);
      cVar28 = (0 < sVar539) * (sVar539 < 0x100) * (char)sVar539 - (0xff < sVar539);
      cVar29 = (0 < sVar541) * (sVar541 < 0x100) * (char)sVar541 - (0xff < sVar541);
      cVar30 = (0 < sVar543) * (sVar543 < 0x100) * (char)sVar543 - (0xff < sVar543);
      cVar31 = (0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 - (0xff < sVar358);
      cVar32 = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
      cVar33 = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
      cVar34 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
      sVar189 = uVar320 - sVar214;
      sVar214 = uVar332 - sVar214;
      sVar215 = uVar334 - sVar216;
      sVar216 = uVar337 - sVar216;
      sVar217 = uVar339 - sVar218;
      sVar218 = uVar341 - sVar218;
      sVar219 = uVar343 - sVar220;
      sVar220 = uVar345 - sVar220;
      bVar35 = (0 < sVar333) * (sVar333 < 0x100) * (char)sVar333 - (0xff < sVar333);
      cVar36 = (0 < sVar338) * (sVar338 < 0x100) * (char)sVar338 - (0xff < sVar338);
      cVar37 = (0 < sVar342) * (sVar342 < 0x100) * (char)sVar342 - (0xff < sVar342);
      cVar38 = (0 < sVar346) * (sVar346 < 0x100) * (char)sVar346 - (0xff < sVar346);
      cVar39 = (0 < sVar214) * (sVar214 < 0x100) * (char)sVar214 - (0xff < sVar214);
      cVar40 = (0 < sVar216) * (sVar216 < 0x100) * (char)sVar216 - (0xff < sVar216);
      cVar41 = (0 < sVar218) * (sVar218 < 0x100) * (char)sVar218 - (0xff < sVar218);
      cVar42 = (0 < sVar220) * (sVar220 < 0x100) * (char)sVar220 - (0xff < sVar220);
      sVar221 = uVar320 + sVar247;
      sVar247 = uVar332 + sVar247;
      sVar244 = uVar334 + sVar272;
      sVar272 = uVar337 + sVar272;
      sVar245 = uVar339 + sVar273;
      sVar273 = uVar341 + sVar273;
      sVar246 = uVar343 + sVar274;
      sVar274 = uVar345 + sVar274;
      bVar43 = (0 < sVar487) * (sVar487 < 0x100) * (char)sVar487 - (0xff < sVar487);
      cVar44 = (0 < sVar489) * (sVar489 < 0x100) * (char)sVar489 - (0xff < sVar489);
      cVar45 = (0 < sVar491) * (sVar491 < 0x100) * (char)sVar491 - (0xff < sVar491);
      cVar46 = (0 < sVar493) * (sVar493 < 0x100) * (char)sVar493 - (0xff < sVar493);
      cVar47 = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
      cVar48 = (0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 - (0xff < sVar272);
      cVar49 = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      cVar50 = (0 < sVar274) * (sVar274 < 0x100) * (char)sVar274 - (0xff < sVar274);
      auVar382._0_8_ =
           CONCAT17(puVar1[0xb],
                    CONCAT16((char)((ushort)sVar218 >> 8),
                             CONCAT15(puVar1[10],
                                      CONCAT14((char)sVar218,
                                               CONCAT13(puVar1[9],
                                                        CONCAT12((char)((ushort)sVar217 >> 8),
                                                                 CONCAT11(puVar1[8],(char)sVar217)))
                                              )))) ^ 0x8000800080008000;
      auVar382[8] = (char)sVar219;
      auVar382[9] = puVar1[0xc] ^ 0x80;
      auVar382[10] = (char)((ushort)sVar219 >> 8);
      auVar382[0xb] = puVar1[0xd] ^ 0x80;
      auVar382[0xc] = (char)sVar220;
      auVar382[0xd] = puVar1[0xe] ^ 0x80;
      auVar382[0xe] = (char)((ushort)sVar220 >> 8);
      auVar382[0xf] = puVar1[0xf] ^ 0x80;
      auVar208 = psraw(auVar382,8);
      auVar305._0_8_ =
           CONCAT17(puVar2[0xb],
                    CONCAT16(auVar303[0xd],
                             CONCAT15(puVar2[10],
                                      CONCAT14(auVar303[0xc],
                                               CONCAT13(puVar2[9],
                                                        CONCAT12(auVar303[0xd],
                                                                 CONCAT11(puVar2[8],auVar303[0xc])))
                                              )))) ^ 0x8000800080008000;
      auVar305[0xc] = auVar303[0xe];
      auVar305[8] = auVar305[0xc];
      auVar305[9] = puVar2[0xc] ^ 0x80;
      auVar305[10] = auVar303[0xf];
      auVar305[0xb] = puVar2[0xd] ^ 0x80;
      auVar305[0xd] = puVar2[0xe] ^ 0x80;
      auVar305[0xe] = auVar303[0xf];
      auVar305[0xf] = puVar2[0xf] ^ 0x80;
      auVar303 = psraw(auVar305,8);
      auVar500._0_2_ = sVar495 * auVar303._0_2_;
      auVar500._2_2_ = sVar504 * auVar303._2_2_;
      auVar500._4_2_ = sVar495 * auVar303._4_2_;
      auVar500._6_2_ = sVar504 * auVar303._6_2_;
      auVar500._8_2_ = sVar495 * auVar303._8_2_;
      auVar500._10_2_ = sVar504 * auVar303._10_2_;
      auVar500._12_2_ = sVar495 * auVar303._12_2_;
      auVar500._14_2_ = sVar504 * auVar303._14_2_;
      auVar355 = psraw(auVar500,6);
      auVar306._0_2_ = auVar303._0_2_ * sVar347 + sVar322 * auVar208._0_2_;
      auVar306._2_2_ = auVar303._2_2_ * sVar349 + sVar336 * auVar208._2_2_;
      auVar306._4_2_ = auVar303._4_2_ * sVar347 + sVar322 * auVar208._4_2_;
      auVar306._6_2_ = auVar303._6_2_ * sVar349 + sVar336 * auVar208._6_2_;
      auVar306._8_2_ = auVar303._8_2_ * sVar347 + sVar322 * auVar208._8_2_;
      auVar306._10_2_ = auVar303._10_2_ * sVar349 + sVar336 * auVar208._10_2_;
      auVar306._12_2_ = auVar303._12_2_ * sVar347 + sVar322 * auVar208._12_2_;
      auVar306._14_2_ = auVar303._14_2_ * sVar349 + sVar336 * auVar208._14_2_;
      auVar303 = psraw(auVar306,7);
      auVar403._0_2_ = auVar208._0_2_ * sVar452;
      auVar403._2_2_ = auVar208._2_2_ * sVar463;
      auVar403._4_2_ = auVar208._4_2_ * sVar452;
      auVar403._6_2_ = auVar208._6_2_ * sVar463;
      auVar403._8_2_ = auVar208._8_2_ * sVar452;
      auVar403._10_2_ = auVar208._10_2_ * sVar463;
      auVar403._12_2_ = auVar208._12_2_ * sVar452;
      auVar403._14_2_ = auVar208._14_2_ * sVar463;
      sVar541 = auVar355._6_2_;
      sVar358 = auVar355._4_2_;
      sVar539 = auVar355._2_2_;
      sVar537 = auVar355._0_2_;
      sVar360 = auVar355._8_2_;
      sVar364 = auVar355._10_2_;
      sVar489 = auVar355._12_2_;
      sVar493 = auVar355._14_2_;
      auVar208 = psubusb(*(undefined1 (*) [16])(Y + lVar184 + uVar188 + 0x10),auVar237);
      auVar130[0xd] = 0;
      auVar130._0_13_ = auVar208._0_13_;
      auVar130[0xe] = auVar208[7];
      auVar133[0xc] = auVar208[6];
      auVar133._0_12_ = auVar208._0_12_;
      auVar133._13_2_ = auVar130._13_2_;
      auVar137[0xb] = 0;
      auVar137._0_11_ = auVar208._0_11_;
      auVar137._12_3_ = auVar133._12_3_;
      auVar141[10] = auVar208[5];
      auVar141._0_10_ = auVar208._0_10_;
      auVar141._11_4_ = auVar137._11_4_;
      auVar145[9] = 0;
      auVar145._0_9_ = auVar208._0_9_;
      auVar145._10_5_ = auVar141._10_5_;
      auVar149[8] = auVar208[4];
      auVar149._0_8_ = auVar208._0_8_;
      auVar149._9_6_ = auVar145._9_6_;
      auVar169._7_8_ = 0;
      auVar169._0_7_ = auVar149._8_7_;
      Var165 = CONCAT81(SUB158(auVar169 << 0x40,7),auVar208[3]);
      auVar178._9_6_ = 0;
      auVar178._0_9_ = Var165;
      auVar170._1_10_ = SUB1510(auVar178 << 0x30,5);
      auVar170[0] = auVar208[2];
      auVar179._11_4_ = 0;
      auVar179._0_11_ = auVar170;
      auVar154[2] = auVar208[1];
      auVar154._0_2_ = auVar208._0_2_;
      auVar154._3_12_ = SUB1512(auVar179 << 0x20,3);
      uVar320 = (ushort)((auVar208._0_2_ & 0xff) * sVar505) >> 7;
      uVar332 = (ushort)(auVar154._2_2_ * sVar506) >> 7;
      uVar334 = (ushort)(auVar170._0_2_ * sVar505) >> 7;
      uVar337 = (ushort)((short)Var165 * sVar506) >> 7;
      uVar339 = (ushort)(auVar149._8_2_ * sVar505) >> 7;
      uVar341 = (ushort)(auVar141._10_2_ * sVar506) >> 7;
      uVar343 = (ushort)(auVar133._12_2_ * sVar505) >> 7;
      uVar345 = (ushort)((auVar130._13_2_ >> 8) * sVar506) >> 7;
      uVar410 = (ushort)((ushort)auVar208[8] * sVar505) >> 7;
      uVar431 = (ushort)((ushort)auVar208[9] * sVar506) >> 7;
      uVar434 = (ushort)((ushort)auVar208[10] * sVar505) >> 7;
      uVar437 = (ushort)((ushort)auVar208[0xb] * sVar506) >> 7;
      uVar440 = (ushort)((ushort)auVar208[0xc] * sVar505) >> 7;
      uVar443 = (ushort)((ushort)auVar208[0xd] * sVar506) >> 7;
      uVar446 = (ushort)((ushort)auVar208[0xe] * sVar505) >> 7;
      uVar449 = (ushort)((ushort)auVar208[0xf] * sVar506) >> 7;
      sVar322 = uVar320 + sVar537;
      sVar333 = uVar332 + sVar537;
      sVar336 = uVar334 + sVar539;
      sVar214 = uVar337 + sVar539;
      sVar216 = uVar339 + sVar358;
      sVar218 = uVar341 + sVar358;
      sVar220 = uVar343 + sVar541;
      sVar347 = uVar345 + sVar541;
      sVar349 = uVar410 + sVar360;
      sVar247 = uVar431 + sVar360;
      sVar272 = uVar434 + sVar364;
      sVar273 = uVar437 + sVar364;
      sVar274 = uVar440 + sVar489;
      sVar275 = uVar443 + sVar489;
      sVar276 = uVar446 + sVar493;
      sVar277 = uVar449 + sVar493;
      bVar51 = (0 < sVar333) * (sVar333 < 0x100) * (char)sVar333 - (0xff < sVar333);
      cVar52 = (0 < sVar214) * (sVar214 < 0x100) * (char)sVar214 - (0xff < sVar214);
      uVar248 = CONCAT13(cVar52,CONCAT12((0 < sVar336) * (sVar336 < 0x100) * (char)sVar336 -
                                         (0xff < sVar336),
                                         CONCAT11(bVar51,(0 < sVar322) * (sVar322 < 0x100) *
                                                         (char)sVar322 - (0xff < sVar322))));
      cVar53 = (0 < sVar218) * (sVar218 < 0x100) * (char)sVar218 - (0xff < sVar218);
      uVar250 = CONCAT15(cVar53,CONCAT14((0 < sVar216) * (sVar216 < 0x100) * (char)sVar216 -
                                         (0xff < sVar216),uVar248));
      cVar54 = (0 < sVar347) * (sVar347 < 0x100) * (char)sVar347 - (0xff < sVar347);
      uVar252 = CONCAT17(cVar54,CONCAT16((0 < sVar220) * (sVar220 < 0x100) * (char)sVar220 -
                                         (0xff < sVar220),uVar250));
      cVar55 = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
      auVar323._0_10_ =
           CONCAT19(cVar55,CONCAT18((0 < sVar349) * (sVar349 < 0x100) * (char)sVar349 -
                                    (0xff < sVar349),uVar252));
      auVar323[10] = (0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 - (0xff < sVar272);
      cVar56 = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      auVar323[0xb] = cVar56;
      auVar326[0xc] = (0 < sVar274) * (sVar274 < 0x100) * (char)sVar274 - (0xff < sVar274);
      auVar326._0_12_ = auVar323;
      cVar57 = (0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 - (0xff < sVar275);
      auVar326[0xd] = cVar57;
      auVar329[0xe] = (0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 - (0xff < sVar276);
      auVar329._0_14_ = auVar326;
      cVar58 = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
      auVar329[0xf] = cVar58;
      sVar346 = auVar303._6_2_;
      sVar342 = auVar303._4_2_;
      sVar338 = auVar303._2_2_;
      sVar278 = auVar303._0_2_;
      sVar464 = auVar303._8_2_;
      sVar481 = auVar303._10_2_;
      sVar483 = auVar303._12_2_;
      sVar485 = auVar303._14_2_;
      sVar349 = uVar320 - sVar278;
      sVar247 = uVar332 - sVar278;
      sVar272 = uVar334 - sVar338;
      sVar273 = uVar337 - sVar338;
      sVar274 = uVar339 - sVar342;
      sVar275 = uVar341 - sVar342;
      sVar276 = uVar343 - sVar346;
      sVar277 = uVar345 - sVar346;
      sVar322 = uVar410 - sVar464;
      sVar333 = uVar431 - sVar464;
      sVar336 = uVar434 - sVar481;
      sVar214 = uVar437 - sVar481;
      sVar216 = uVar440 - sVar483;
      sVar218 = uVar443 - sVar483;
      sVar220 = uVar446 - sVar485;
      sVar347 = uVar449 - sVar485;
      bVar59 = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
      cVar60 = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      uVar508 = CONCAT13(cVar60,CONCAT12((0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 -
                                         (0xff < sVar272),
                                         CONCAT11(bVar59,(0 < sVar349) * (sVar349 < 0x100) *
                                                         (char)sVar349 - (0xff < sVar349))));
      cVar61 = (0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 - (0xff < sVar275);
      uVar509 = CONCAT15(cVar61,CONCAT14((0 < sVar274) * (sVar274 < 0x100) * (char)sVar274 -
                                         (0xff < sVar274),uVar508));
      cVar62 = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
      uVar510 = CONCAT17(cVar62,CONCAT16((0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 -
                                         (0xff < sVar276),uVar509));
      cVar63 = (0 < sVar333) * (sVar333 < 0x100) * (char)sVar333 - (0xff < sVar333);
      auVar544._0_10_ =
           CONCAT19(cVar63,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * (char)sVar322 -
                                    (0xff < sVar322),uVar510));
      auVar544[10] = (0 < sVar336) * (sVar336 < 0x100) * (char)sVar336 - (0xff < sVar336);
      cVar64 = (0 < sVar214) * (sVar214 < 0x100) * (char)sVar214 - (0xff < sVar214);
      auVar544[0xb] = cVar64;
      auVar545[0xc] = (0 < sVar216) * (sVar216 < 0x100) * (char)sVar216 - (0xff < sVar216);
      auVar545._0_12_ = auVar544;
      cVar65 = (0 < sVar218) * (sVar218 < 0x100) * (char)sVar218 - (0xff < sVar218);
      auVar545[0xd] = cVar65;
      auVar546[0xe] = (0 < sVar220) * (sVar220 < 0x100) * (char)sVar220 - (0xff < sVar220);
      auVar546._0_14_ = auVar545;
      cVar66 = (0 < sVar347) * (sVar347 < 0x100) * (char)sVar347 - (0xff < sVar347);
      auVar546[0xf] = cVar66;
      auVar208 = psraw(auVar403,6);
      sVar214 = auVar208._6_2_;
      sVar336 = auVar208._4_2_;
      sVar333 = auVar208._2_2_;
      sVar322 = auVar208._0_2_;
      sVar216 = auVar208._8_2_;
      sVar218 = auVar208._10_2_;
      sVar220 = auVar208._12_2_;
      sVar347 = auVar208._14_2_;
      sVar349 = uVar320 + sVar322;
      sVar247 = uVar332 + sVar322;
      sVar272 = uVar334 + sVar333;
      sVar273 = uVar337 + sVar333;
      sVar274 = uVar339 + sVar336;
      sVar275 = uVar341 + sVar336;
      sVar276 = uVar343 + sVar214;
      sVar277 = uVar345 + sVar214;
      sVar543 = uVar410 + sVar216;
      sVar362 = uVar431 + sVar216;
      sVar487 = uVar434 + sVar218;
      sVar491 = uVar437 + sVar218;
      sVar411 = uVar440 + sVar220;
      sVar432 = uVar443 + sVar220;
      sVar435 = uVar446 + sVar347;
      sVar438 = uVar449 + sVar347;
      bVar67 = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
      cVar68 = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      uVar222 = CONCAT13(cVar68,CONCAT12((0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 -
                                         (0xff < sVar272),
                                         CONCAT11(bVar67,(0 < sVar349) * (sVar349 < 0x100) *
                                                         (char)sVar349 - (0xff < sVar349))));
      cVar69 = (0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 - (0xff < sVar275);
      uVar223 = CONCAT15(cVar69,CONCAT14((0 < sVar274) * (sVar274 < 0x100) * (char)sVar274 -
                                         (0xff < sVar274),uVar222));
      cVar70 = (0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 - (0xff < sVar277);
      uVar224 = CONCAT17(cVar70,CONCAT16((0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 -
                                         (0xff < sVar276),uVar223));
      cVar71 = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
      auVar254._0_10_ =
           CONCAT19(cVar71,CONCAT18((0 < sVar543) * (sVar543 < 0x100) * (char)sVar543 -
                                    (0xff < sVar543),uVar224));
      auVar254[10] = (0 < sVar487) * (sVar487 < 0x100) * (char)sVar487 - (0xff < sVar487);
      cVar72 = (0 < sVar491) * (sVar491 < 0x100) * (char)sVar491 - (0xff < sVar491);
      auVar254[0xb] = cVar72;
      auVar260[0xc] = (0 < sVar411) * (sVar411 < 0x100) * (char)sVar411 - (0xff < sVar411);
      auVar260._0_12_ = auVar254;
      cVar73 = (0 < sVar432) * (sVar432 < 0x100) * (char)sVar432 - (0xff < sVar432);
      auVar260[0xd] = cVar73;
      auVar266[0xe] = (0 < sVar435) * (sVar435 < 0x100) * (char)sVar435 - (0xff < sVar435);
      auVar266._0_14_ = auVar260;
      cVar74 = (0 < sVar438) * (sVar438 < 0x100) * (char)sVar438 - (0xff < sVar438);
      auVar266[0xf] = cVar74;
      auVar208 = psubusb(*(undefined1 (*) [16])(Y + lVar184 + (ulong)Y_stride + 0x10),auVar237);
      auVar134[0xd] = 0;
      auVar134._0_13_ = auVar208._0_13_;
      auVar134[0xe] = auVar208[7];
      auVar138[0xc] = auVar208[6];
      auVar138._0_12_ = auVar208._0_12_;
      auVar138._13_2_ = auVar134._13_2_;
      auVar142[0xb] = 0;
      auVar142._0_11_ = auVar208._0_11_;
      auVar142._12_3_ = auVar138._12_3_;
      auVar146[10] = auVar208[5];
      auVar146._0_10_ = auVar208._0_10_;
      auVar146._11_4_ = auVar142._11_4_;
      auVar150[9] = 0;
      auVar150._0_9_ = auVar208._0_9_;
      auVar150._10_5_ = auVar146._10_5_;
      auVar151[8] = auVar208[4];
      auVar151._0_8_ = auVar208._0_8_;
      auVar151._9_6_ = auVar150._9_6_;
      auVar171._7_8_ = 0;
      auVar171._0_7_ = auVar151._8_7_;
      Var165 = CONCAT81(SUB158(auVar171 << 0x40,7),auVar208[3]);
      auVar180._9_6_ = 0;
      auVar180._0_9_ = Var165;
      auVar172._1_10_ = SUB1510(auVar180 << 0x30,5);
      auVar172[0] = auVar208[2];
      auVar181._11_4_ = 0;
      auVar181._0_11_ = auVar172;
      auVar173._1_12_ = SUB1512(auVar181 << 0x20,3);
      auVar173[0] = auVar208[1];
      uVar320 = (ushort)((ushort)auVar208[0] * sVar505) >> 7;
      uVar332 = (ushort)(auVar173._0_2_ * sVar506) >> 7;
      uVar334 = (ushort)(auVar172._0_2_ * sVar505) >> 7;
      uVar337 = (ushort)((short)Var165 * sVar506) >> 7;
      uVar339 = (ushort)(auVar151._8_2_ * sVar505) >> 7;
      uVar341 = (ushort)(auVar146._10_2_ * sVar506) >> 7;
      uVar343 = (ushort)(auVar138._12_2_ * sVar505) >> 7;
      uVar345 = (ushort)((auVar134._13_2_ >> 8) * sVar506) >> 7;
      sVar411 = uVar320 - sVar278;
      sVar278 = uVar332 - sVar278;
      sVar432 = uVar334 - sVar338;
      sVar338 = uVar337 - sVar338;
      sVar435 = uVar339 - sVar342;
      sVar342 = uVar341 - sVar342;
      sVar438 = uVar343 - sVar346;
      sVar346 = uVar345 - sVar346;
      sVar349 = sVar537 + uVar320;
      sVar537 = sVar537 + uVar332;
      sVar247 = sVar539 + uVar334;
      sVar539 = sVar539 + uVar337;
      sVar272 = sVar358 + uVar339;
      sVar358 = sVar358 + uVar341;
      sVar273 = sVar541 + uVar343;
      sVar541 = sVar541 + uVar345;
      sVar274 = uVar320 + sVar322;
      sVar322 = uVar332 + sVar322;
      sVar275 = uVar334 + sVar333;
      sVar333 = uVar337 + sVar333;
      sVar276 = uVar339 + sVar336;
      sVar336 = uVar341 + sVar336;
      sVar277 = uVar343 + sVar214;
      sVar214 = uVar345 + sVar214;
      uVar320 = (ushort)((ushort)auVar208[8] * sVar505) >> 7;
      uVar332 = (ushort)((ushort)auVar208[9] * sVar506) >> 7;
      uVar334 = (ushort)((ushort)auVar208[10] * sVar505) >> 7;
      uVar337 = (ushort)((ushort)auVar208[0xb] * sVar506) >> 7;
      uVar339 = (ushort)((ushort)auVar208[0xc] * sVar505) >> 7;
      uVar341 = (ushort)((ushort)auVar208[0xd] * sVar506) >> 7;
      uVar343 = (ushort)((ushort)auVar208[0xe] * sVar505) >> 7;
      uVar345 = (ushort)((ushort)auVar208[0xf] * sVar506) >> 7;
      sVar543 = sVar360 + uVar320;
      sVar360 = sVar360 + uVar332;
      sVar362 = sVar364 + uVar334;
      sVar364 = sVar364 + uVar337;
      sVar487 = sVar489 + uVar339;
      sVar489 = sVar489 + uVar341;
      sVar491 = sVar493 + uVar343;
      sVar493 = sVar493 + uVar345;
      bVar75 = (0 < sVar537) * (sVar537 < 0x100) * (char)sVar537 - (0xff < sVar537);
      cVar76 = (0 < sVar539) * (sVar539 < 0x100) * (char)sVar539 - (0xff < sVar539);
      uVar365 = CONCAT13(cVar76,CONCAT12((0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 -
                                         (0xff < sVar247),
                                         CONCAT11(bVar75,(0 < sVar349) * (sVar349 < 0x100) *
                                                         (char)sVar349 - (0xff < sVar349))));
      cVar77 = (0 < sVar358) * (sVar358 < 0x100) * (char)sVar358 - (0xff < sVar358);
      uVar366 = CONCAT15(cVar77,CONCAT14((0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 -
                                         (0xff < sVar272),uVar365));
      cVar78 = (0 < sVar541) * (sVar541 < 0x100) * (char)sVar541 - (0xff < sVar541);
      uVar367 = CONCAT17(cVar78,CONCAT16((0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 -
                                         (0xff < sVar273),uVar366));
      cVar79 = (0 < sVar360) * (sVar360 < 0x100) * (char)sVar360 - (0xff < sVar360);
      auVar368._0_10_ =
           CONCAT19(cVar79,CONCAT18((0 < sVar543) * (sVar543 < 0x100) * (char)sVar543 -
                                    (0xff < sVar543),uVar367));
      auVar368[10] = (0 < sVar362) * (sVar362 < 0x100) * (char)sVar362 - (0xff < sVar362);
      cVar80 = (0 < sVar364) * (sVar364 < 0x100) * (char)sVar364 - (0xff < sVar364);
      auVar368[0xb] = cVar80;
      auVar371[0xc] = (0 < sVar487) * (sVar487 < 0x100) * (char)sVar487 - (0xff < sVar487);
      auVar371._0_12_ = auVar368;
      cVar81 = (0 < sVar489) * (sVar489 < 0x100) * (char)sVar489 - (0xff < sVar489);
      auVar371[0xd] = cVar81;
      auVar384[0xe] = (0 < sVar491) * (sVar491 < 0x100) * (char)sVar491 - (0xff < sVar491);
      auVar384._0_14_ = auVar371;
      cVar82 = (0 < sVar493) * (sVar493 < 0x100) * (char)sVar493 - (0xff < sVar493);
      auVar384[0xf] = cVar82;
      sVar349 = uVar320 - sVar464;
      sVar464 = uVar332 - sVar464;
      sVar247 = uVar334 - sVar481;
      sVar481 = uVar337 - sVar481;
      sVar272 = uVar339 - sVar483;
      sVar483 = uVar341 - sVar483;
      sVar273 = uVar343 - sVar485;
      sVar485 = uVar345 - sVar485;
      bVar83 = (0 < sVar278) * (sVar278 < 0x100) * (char)sVar278 - (0xff < sVar278);
      cVar84 = (0 < sVar338) * (sVar338 < 0x100) * (char)sVar338 - (0xff < sVar338);
      uVar531 = CONCAT13(cVar84,CONCAT12((0 < sVar432) * (sVar432 < 0x100) * (char)sVar432 -
                                         (0xff < sVar432),
                                         CONCAT11(bVar83,(0 < sVar411) * (sVar411 < 0x100) *
                                                         (char)sVar411 - (0xff < sVar411))));
      cVar85 = (0 < sVar342) * (sVar342 < 0x100) * (char)sVar342 - (0xff < sVar342);
      uVar532 = CONCAT15(cVar85,CONCAT14((0 < sVar435) * (sVar435 < 0x100) * (char)sVar435 -
                                         (0xff < sVar435),uVar531));
      cVar86 = (0 < sVar346) * (sVar346 < 0x100) * (char)sVar346 - (0xff < sVar346);
      uVar533 = CONCAT17(cVar86,CONCAT16((0 < sVar438) * (sVar438 < 0x100) * (char)sVar438 -
                                         (0xff < sVar438),uVar532));
      cVar87 = (0 < sVar464) * (sVar464 < 0x100) * (char)sVar464 - (0xff < sVar464);
      auVar534._0_10_ =
           CONCAT19(cVar87,CONCAT18((0 < sVar349) * (sVar349 < 0x100) * (char)sVar349 -
                                    (0xff < sVar349),uVar533));
      auVar534[10] = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
      cVar88 = (0 < sVar481) * (sVar481 < 0x100) * (char)sVar481 - (0xff < sVar481);
      auVar534[0xb] = cVar88;
      auVar535[0xc] = (0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 - (0xff < sVar272);
      auVar535._0_12_ = auVar534;
      cVar89 = (0 < sVar483) * (sVar483 < 0x100) * (char)sVar483 - (0xff < sVar483);
      auVar535[0xd] = cVar89;
      auVar536[0xe] = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      auVar536._0_14_ = auVar535;
      cVar90 = (0 < sVar485) * (sVar485 < 0x100) * (char)sVar485 - (0xff < sVar485);
      auVar536[0xf] = cVar90;
      sVar349 = uVar320 + sVar216;
      sVar216 = uVar332 + sVar216;
      sVar247 = uVar334 + sVar218;
      sVar218 = uVar337 + sVar218;
      sVar272 = uVar339 + sVar220;
      sVar220 = uVar341 + sVar220;
      sVar273 = uVar343 + sVar347;
      sVar347 = uVar345 + sVar347;
      bVar91 = (0 < sVar322) * (sVar322 < 0x100) * (char)sVar322 - (0xff < sVar322);
      cVar92 = (0 < sVar333) * (sVar333 < 0x100) * (char)sVar333 - (0xff < sVar333);
      uVar388 = CONCAT13(cVar92,CONCAT12((0 < sVar275) * (sVar275 < 0x100) * (char)sVar275 -
                                         (0xff < sVar275),
                                         CONCAT11(bVar91,(0 < sVar274) * (sVar274 < 0x100) *
                                                         (char)sVar274 - (0xff < sVar274))));
      cVar93 = (0 < sVar336) * (sVar336 < 0x100) * (char)sVar336 - (0xff < sVar336);
      uVar389 = CONCAT15(cVar93,CONCAT14((0 < sVar276) * (sVar276 < 0x100) * (char)sVar276 -
                                         (0xff < sVar276),uVar388));
      cVar94 = (0 < sVar214) * (sVar214 < 0x100) * (char)sVar214 - (0xff < sVar214);
      uVar390 = CONCAT17(cVar94,CONCAT16((0 < sVar277) * (sVar277 < 0x100) * (char)sVar277 -
                                         (0xff < sVar277),uVar389));
      cVar95 = (0 < sVar216) * (sVar216 < 0x100) * (char)sVar216 - (0xff < sVar216);
      auVar456._0_10_ =
           CONCAT19(cVar95,CONCAT18((0 < sVar349) * (sVar349 < 0x100) * (char)sVar349 -
                                    (0xff < sVar349),uVar390));
      auVar456[10] = (0 < sVar247) * (sVar247 < 0x100) * (char)sVar247 - (0xff < sVar247);
      cVar96 = (0 < sVar218) * (sVar218 < 0x100) * (char)sVar218 - (0xff < sVar218);
      auVar456[0xb] = cVar96;
      auVar458[0xc] = (0 < sVar272) * (sVar272 < 0x100) * (char)sVar272 - (0xff < sVar272);
      auVar458._0_12_ = auVar456;
      cVar97 = (0 < sVar220) * (sVar220 < 0x100) * (char)sVar220 - (0xff < sVar220);
      auVar458[0xd] = cVar97;
      auVar460[0xe] = (0 < sVar273) * (sVar273 < 0x100) * (char)sVar273 - (0xff < sVar273);
      auVar460._0_14_ = auVar458;
      cVar98 = (0 < sVar347) * (sVar347 < 0x100) * (char)sVar347 - (0xff < sVar347);
      auVar460[0xf] = cVar98;
      auVar303 = auVar476 & _DAT_0010a570;
      auVar208 = auVar329 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar99 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar100 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar191 = CONCAT13(cVar100,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                          (0xff < sVar333),
                                          CONCAT11(bVar99,(0 < sVar322) * (sVar322 < 0x100) *
                                                          auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar101 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar193 = CONCAT15(cVar101,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                          (0xff < sVar322),uVar191));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar102 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar195 = CONCAT17(cVar102,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                          (0xff < sVar322),uVar193));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar103 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar283._0_10_ =
           CONCAT19(cVar103,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                     (0xff < sVar322),uVar195));
      sVar322 = auVar208._4_2_;
      auVar283[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar104 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar283[0xb] = cVar104;
      sVar322 = auVar208._8_2_;
      auVar289[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar289._0_12_ = auVar283;
      sVar322 = auVar208._10_2_;
      cVar105 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar289[0xd] = cVar105;
      sVar322 = auVar208._12_2_;
      auVar307[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar307._0_14_ = auVar289;
      sVar322 = auVar208._14_2_;
      cVar106 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar307[0xf] = cVar106;
      auVar303 = auVar519 & _DAT_0010a570;
      auVar208 = auVar546 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar107 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar108 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar249 = CONCAT13(cVar108,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                          (0xff < sVar333),
                                          CONCAT11(bVar107,(0 < sVar322) * (sVar322 < 0x100) *
                                                           auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar109 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar251 = CONCAT15(cVar109,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                          (0xff < sVar322),uVar249));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar110 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar253 = CONCAT17(cVar110,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                          (0xff < sVar322),uVar251));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar111 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar391._0_10_ =
           CONCAT19(cVar111,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                     (0xff < sVar322),uVar253));
      sVar322 = auVar208._4_2_;
      auVar391[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar112 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar391[0xb] = cVar112;
      sVar322 = auVar208._8_2_;
      auVar396[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar396._0_12_ = auVar391;
      sVar322 = auVar208._10_2_;
      cVar113 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar396[0xd] = cVar113;
      sVar322 = auVar208._12_2_;
      auVar401[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar401._0_14_ = auVar396;
      sVar322 = auVar208._14_2_;
      cVar114 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar401[0xf] = cVar114;
      auVar208 = auVar426 & _DAT_0010a570;
      auVar303 = auVar266 & _DAT_0010a570;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar115 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar116 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar190 = CONCAT13(cVar116,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                          (0xff < sVar333),
                                          CONCAT11(bVar115,(0 < sVar322) * (sVar322 < 0x100) *
                                                           auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar117 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar192 = CONCAT15(cVar117,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                          (0xff < sVar322),uVar190));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar118 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar194 = CONCAT17(cVar118,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                          (0xff < sVar322),uVar192));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar119 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar196._0_10_ =
           CONCAT19(cVar119,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                     (0xff < sVar322),uVar194));
      sVar322 = auVar303._4_2_;
      auVar196[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar120 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar196[0xb] = cVar120;
      sVar322 = auVar303._8_2_;
      auVar202[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar202._0_12_ = auVar196;
      sVar322 = auVar303._10_2_;
      cVar121 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar202[0xd] = cVar121;
      sVar322 = auVar303._12_2_;
      auVar503[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar503._0_14_ = auVar202;
      sVar322 = auVar303._14_2_;
      cVar122 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar503[0xf] = cVar122;
      uVar410 = (ushort)bVar3;
      uVar431 = (ushort)((uint)uVar413 >> 0x18);
      uVar434 = (ushort)((uint6)uVar414 >> 0x28);
      uVar437 = (ushort)((ulong)uVar415 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar466._0_10_ >> 0x48);
      uVar443 = auVar466._10_2_ >> 8;
      uVar446 = auVar471._12_2_ >> 8;
      uVar449 = auVar476._14_2_ >> 8;
      uVar320 = (ushort)bVar51;
      uVar332 = (ushort)((uint)uVar248 >> 0x18);
      uVar334 = (ushort)((uint6)uVar250 >> 0x28);
      uVar337 = (ushort)((ulong)uVar252 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar323._0_10_ >> 0x48);
      uVar341 = auVar323._10_2_ >> 8;
      uVar343 = auVar326._12_2_ >> 8;
      uVar345 = auVar329._14_2_ >> 8;
      bVar123 = (uVar431 != 0) * (uVar431 < 0x100) * cVar4 - (0xff < uVar431);
      cVar124 = (uVar437 != 0) * (uVar437 < 0x100) * cVar6 - (0xff < uVar437);
      uVar413 = CONCAT13(cVar124,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar5 -
                                          (0xff < uVar434),
                                          CONCAT11(bVar123,(uVar410 != 0) * (uVar410 < 0x100) *
                                                           bVar3 - (0xff < uVar410))));
      cVar4 = (uVar443 != 0) * (uVar443 < 0x100) * cVar8 - (0xff < uVar443);
      uVar414 = CONCAT15(cVar4,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar7 -
                                        (0xff < uVar440),uVar413));
      cVar5 = (uVar449 != 0) * (uVar449 < 0x100) * cVar10 - (0xff < uVar449);
      uVar415 = CONCAT17(cVar5,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar9 -
                                        (0xff < uVar446),uVar414));
      cVar9 = (uVar332 != 0) * (uVar332 < 0x100) * cVar52 - (0xff < uVar332);
      auVar467._0_10_ =
           CONCAT19(cVar9,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar51 - (0xff < uVar320),
                                   uVar415));
      auVar467[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar53 - (0xff < uVar334);
      cVar8 = (uVar337 != 0) * (uVar337 < 0x100) * cVar54 - (0xff < uVar337);
      auVar467[0xb] = cVar8;
      auVar472[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar55 - (0xff < uVar339);
      auVar472._0_12_ = auVar467;
      cVar7 = (uVar341 != 0) * (uVar341 < 0x100) * cVar56 - (0xff < uVar341);
      auVar472[0xd] = cVar7;
      auVar477[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar57 - (0xff < uVar343);
      auVar477._0_14_ = auVar472;
      cVar6 = (uVar345 != 0) * (uVar345 < 0x100) * cVar58 - (0xff < uVar345);
      auVar477[0xf] = cVar6;
      uVar320 = (ushort)bVar11;
      uVar332 = (ushort)((uint)uVar453 >> 0x18);
      uVar334 = (ushort)((uint6)uVar454 >> 0x28);
      uVar337 = (ushort)((ulong)uVar455 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar511._0_10_ >> 0x48);
      uVar341 = auVar511._10_2_ >> 8;
      uVar343 = auVar515._12_2_ >> 8;
      uVar345 = auVar519._14_2_ >> 8;
      uVar410 = (ushort)bVar59;
      uVar431 = (ushort)((uint)uVar508 >> 0x18);
      uVar434 = (ushort)((uint6)uVar509 >> 0x28);
      uVar437 = (ushort)((ulong)uVar510 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar544._0_10_ >> 0x48);
      uVar443 = auVar544._10_2_ >> 8;
      uVar446 = auVar545._12_2_ >> 8;
      uVar449 = auVar546._14_2_ >> 8;
      bVar3 = (uVar332 != 0) * (uVar332 < 0x100) * cVar12 - (0xff < uVar332);
      cVar10 = (uVar337 != 0) * (uVar337 < 0x100) * cVar14 - (0xff < uVar337);
      uVar508 = CONCAT13(cVar10,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar13 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar3,(uVar320 != 0) * (uVar320 < 0x100) * bVar11
                                                        - (0xff < uVar320))));
      cVar16 = (uVar341 != 0) * (uVar341 < 0x100) * cVar16 - (0xff < uVar341);
      uVar509 = CONCAT15(cVar16,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar15 -
                                         (0xff < uVar339),uVar508));
      cVar18 = (uVar345 != 0) * (uVar345 < 0x100) * cVar18 - (0xff < uVar345);
      uVar510 = CONCAT17(cVar18,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar17 -
                                         (0xff < uVar343),uVar509));
      cVar17 = (uVar431 != 0) * (uVar431 < 0x100) * cVar60 - (0xff < uVar431);
      auVar512._0_10_ =
           CONCAT19(cVar17,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar59 - (0xff < uVar410),
                                    uVar510));
      auVar512[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar61 - (0xff < uVar434);
      cVar15 = (uVar437 != 0) * (uVar437 < 0x100) * cVar62 - (0xff < uVar437);
      auVar512[0xb] = cVar15;
      auVar516[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar63 - (0xff < uVar440);
      auVar516._0_12_ = auVar512;
      cVar14 = (uVar443 != 0) * (uVar443 < 0x100) * cVar64 - (0xff < uVar443);
      auVar516[0xd] = cVar14;
      auVar520[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar65 - (0xff < uVar446);
      auVar520._0_14_ = auVar516;
      cVar13 = (uVar449 != 0) * (uVar449 < 0x100) * cVar66 - (0xff < uVar449);
      auVar520[0xf] = cVar13;
      uVar410 = (ushort)bVar19;
      uVar431 = (ushort)((uint)uVar280 >> 0x18);
      uVar434 = (ushort)((uint6)uVar281 >> 0x28);
      uVar437 = (ushort)((ulong)uVar282 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar416._0_10_ >> 0x48);
      uVar443 = auVar416._10_2_ >> 8;
      uVar446 = auVar421._12_2_ >> 8;
      uVar449 = auVar426._14_2_ >> 8;
      uVar320 = (ushort)bVar67;
      uVar332 = (ushort)((uint)uVar222 >> 0x18);
      uVar334 = (ushort)((uint6)uVar223 >> 0x28);
      uVar337 = (ushort)((ulong)uVar224 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar254._0_10_ >> 0x48);
      uVar341 = auVar254._10_2_ >> 8;
      uVar343 = auVar260._12_2_ >> 8;
      uVar345 = auVar266._14_2_ >> 8;
      bVar11 = (uVar431 != 0) * (uVar431 < 0x100) * cVar20 - (0xff < uVar431);
      cVar52 = (uVar437 != 0) * (uVar437 < 0x100) * cVar22 - (0xff < uVar437);
      uVar280 = CONCAT13(cVar52,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar21 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar11,(uVar410 != 0) * (uVar410 < 0x100) * bVar19
                                                         - (0xff < uVar410))));
      cVar24 = (uVar443 != 0) * (uVar443 < 0x100) * cVar24 - (0xff < uVar443);
      uVar281 = CONCAT15(cVar24,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar23 -
                                         (0xff < uVar440),uVar280));
      cVar23 = (uVar449 != 0) * (uVar449 < 0x100) * cVar26 - (0xff < uVar449);
      uVar282 = CONCAT17(cVar23,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar25 -
                                         (0xff < uVar446),uVar281));
      cVar22 = (uVar332 != 0) * (uVar332 < 0x100) * cVar68 - (0xff < uVar332);
      auVar417._0_10_ =
           CONCAT19(cVar22,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar67 - (0xff < uVar320),
                                    uVar282));
      auVar417[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar69 - (0xff < uVar334);
      cVar12 = (uVar337 != 0) * (uVar337 < 0x100) * cVar70 - (0xff < uVar337);
      auVar417[0xb] = cVar12;
      auVar422[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar71 - (0xff < uVar339);
      auVar422._0_12_ = auVar417;
      cVar21 = (uVar341 != 0) * (uVar341 < 0x100) * cVar72 - (0xff < uVar341);
      auVar422[0xd] = cVar21;
      auVar427[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar73 - (0xff < uVar343);
      auVar427._0_14_ = auVar422;
      cVar20 = (uVar345 != 0) * (uVar345 < 0x100) * cVar74 - (0xff < uVar345);
      auVar427[0xf] = cVar20;
      auVar303 = auVar307 & _DAT_0010a570;
      auVar208 = auVar401 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar19 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar25 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar453 = CONCAT13(cVar25,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar19,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar26 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar454 = CONCAT15(cVar26,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar453));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar53 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar455 = CONCAT17(cVar53,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar454));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar54 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar496._0_10_ =
           CONCAT19(cVar54,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar455));
      sVar322 = auVar208._4_2_;
      auVar496[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar55 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar496[0xb] = cVar55;
      sVar322 = auVar208._8_2_;
      auVar498[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar498._0_12_ = auVar496;
      sVar322 = auVar208._10_2_;
      cVar56 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar498[0xd] = cVar56;
      sVar322 = auVar208._12_2_;
      auVar501[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar501._0_14_ = auVar498;
      sVar322 = auVar208._14_2_;
      cVar57 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar501[0xf] = cVar57;
      auVar303 = auVar503 & _DAT_0010a570;
      auVar208 = auVar477 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar51 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar58 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar248 = CONCAT13(cVar58,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar51,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar63 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar250 = CONCAT15(cVar63,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar248));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar62 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar252 = CONCAT17(cVar62,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar250));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar61 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar255._0_10_ =
           CONCAT19(cVar61,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar252));
      sVar322 = auVar208._4_2_;
      auVar255[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar64 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar255[0xb] = cVar64;
      sVar322 = auVar208._8_2_;
      auVar261[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar261._0_12_ = auVar255;
      sVar322 = auVar208._10_2_;
      cVar66 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar261[0xd] = cVar66;
      sVar322 = auVar208._12_2_;
      auVar267[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar267._0_14_ = auVar261;
      sVar322 = auVar208._14_2_;
      cVar65 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar267[0xf] = cVar65;
      auVar208 = auVar520 & _DAT_0010a570;
      auVar303 = auVar427 & _DAT_0010a570;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar59 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar60 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar222 = CONCAT13(cVar60,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar59,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar68 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar223 = CONCAT15(cVar68,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                         (0xff < sVar322),uVar222));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar69 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar224 = CONCAT17(cVar69,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                         (0xff < sVar322),uVar223));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar70 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar225._0_10_ =
           CONCAT19(cVar70,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                    (0xff < sVar322),uVar224));
      sVar322 = auVar303._4_2_;
      auVar225[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar71 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar225[0xb] = cVar71;
      sVar322 = auVar303._8_2_;
      auVar231[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar231._0_12_ = auVar225;
      sVar322 = auVar303._10_2_;
      cVar72 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar231[0xd] = cVar72;
      sVar322 = auVar303._12_2_;
      auVar238[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar238._0_14_ = auVar231;
      sVar322 = auVar303._14_2_;
      cVar73 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar238[0xf] = cVar73;
      uVar320 = (ushort)bVar99;
      uVar332 = (ushort)((uint)uVar191 >> 0x18);
      uVar334 = (ushort)((uint6)uVar193 >> 0x28);
      uVar337 = (ushort)((ulong)uVar195 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar283._0_10_ >> 0x48);
      uVar341 = auVar283._10_2_ >> 8;
      uVar343 = auVar289._12_2_ >> 8;
      uVar345 = auVar307._14_2_ >> 8;
      uVar410 = (ushort)bVar107;
      uVar431 = (ushort)((uint)uVar249 >> 0x18);
      uVar434 = (ushort)((uint6)uVar251 >> 0x28);
      uVar437 = (ushort)((ulong)uVar253 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar391._0_10_ >> 0x48);
      uVar443 = auVar391._10_2_ >> 8;
      uVar446 = auVar396._12_2_ >> 8;
      uVar449 = auVar401._14_2_ >> 8;
      bVar67 = (uVar332 != 0) * (uVar332 < 0x100) * cVar100 - (0xff < uVar332);
      cVar74 = (uVar337 != 0) * (uVar337 < 0x100) * cVar102 - (0xff < uVar337);
      uVar191 = CONCAT13(cVar74,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar101 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar67,(uVar320 != 0) * (uVar320 < 0x100) * bVar99
                                                         - (0xff < uVar320))));
      cVar125 = (uVar341 != 0) * (uVar341 < 0x100) * cVar104 - (0xff < uVar341);
      uVar193 = CONCAT15(cVar125,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar103 -
                                          (0xff < uVar339),uVar191));
      cVar104 = (uVar345 != 0) * (uVar345 < 0x100) * cVar106 - (0xff < uVar345);
      uVar195 = CONCAT17(cVar104,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar105 -
                                          (0xff < uVar343),uVar193));
      cVar103 = (uVar431 != 0) * (uVar431 < 0x100) * cVar108 - (0xff < uVar431);
      auVar284._0_10_ =
           CONCAT19(cVar103,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar107 - (0xff < uVar410)
                                     ,uVar195));
      auVar284[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar109 - (0xff < uVar434);
      cVar102 = (uVar437 != 0) * (uVar437 < 0x100) * cVar110 - (0xff < uVar437);
      auVar284[0xb] = cVar102;
      auVar290[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar111 - (0xff < uVar440);
      auVar290._0_12_ = auVar284;
      cVar101 = (uVar443 != 0) * (uVar443 < 0x100) * cVar112 - (0xff < uVar443);
      auVar290[0xd] = cVar101;
      auVar308[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar113 - (0xff < uVar446);
      auVar308._0_14_ = auVar290;
      cVar100 = (uVar449 != 0) * (uVar449 < 0x100) * cVar114 - (0xff < uVar449);
      auVar308[0xf] = cVar100;
      uVar320 = (ushort)bVar115;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar196._0_10_ >> 0x48);
      uVar341 = auVar196._10_2_ >> 8;
      uVar343 = auVar202._12_2_ >> 8;
      uVar345 = auVar503._14_2_ >> 8;
      uVar410 = (ushort)bVar123;
      uVar431 = (ushort)((uint)uVar413 >> 0x18);
      uVar434 = (ushort)((uint6)uVar414 >> 0x28);
      uVar437 = (ushort)((ulong)uVar415 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar467._0_10_ >> 0x48);
      uVar443 = auVar467._10_2_ >> 8;
      uVar446 = auVar472._12_2_ >> 8;
      uVar449 = auVar477._14_2_ >> 8;
      bVar99 = (uVar332 != 0) * (uVar332 < 0x100) * cVar116 - (0xff < uVar332);
      cVar112 = (uVar337 != 0) * (uVar337 < 0x100) * cVar118 - (0xff < uVar337);
      uVar190 = CONCAT13(cVar112,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar117 -
                                          (0xff < uVar334),
                                          CONCAT11(bVar99,(uVar320 != 0) * (uVar320 < 0x100) *
                                                          bVar115 - (0xff < uVar320))));
      cVar106 = (uVar341 != 0) * (uVar341 < 0x100) * cVar120 - (0xff < uVar341);
      uVar192 = CONCAT15(cVar106,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar119 -
                                          (0xff < uVar339),uVar190));
      cVar105 = (uVar345 != 0) * (uVar345 < 0x100) * cVar122 - (0xff < uVar345);
      uVar194 = CONCAT17(cVar105,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar121 -
                                          (0xff < uVar343),uVar192));
      cVar114 = (uVar431 != 0) * (uVar431 < 0x100) * cVar124 - (0xff < uVar431);
      auVar197._0_10_ =
           CONCAT19(cVar114,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar123 - (0xff < uVar410)
                                     ,uVar194));
      auVar197[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar4 - (0xff < uVar434);
      cVar4 = (uVar437 != 0) * (uVar437 < 0x100) * cVar5 - (0xff < uVar437);
      auVar197[0xb] = cVar4;
      auVar203[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar9 - (0xff < uVar440);
      auVar203._0_12_ = auVar197;
      cVar8 = (uVar443 != 0) * (uVar443 < 0x100) * cVar8 - (0xff < uVar443);
      auVar203[0xd] = cVar8;
      auVar209[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar7 - (0xff < uVar446);
      auVar209._0_14_ = auVar203;
      cVar5 = (uVar449 != 0) * (uVar449 < 0x100) * cVar6 - (0xff < uVar449);
      auVar209[0xf] = cVar5;
      uVar410 = (ushort)bVar3;
      uVar431 = (ushort)((uint)uVar508 >> 0x18);
      uVar434 = (ushort)((uint6)uVar509 >> 0x28);
      uVar437 = (ushort)((ulong)uVar510 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar512._0_10_ >> 0x48);
      uVar443 = auVar512._10_2_ >> 8;
      uVar446 = auVar516._12_2_ >> 8;
      uVar449 = auVar520._14_2_ >> 8;
      uVar320 = (ushort)bVar11;
      uVar332 = (ushort)((uint)uVar280 >> 0x18);
      uVar334 = (ushort)((uint6)uVar281 >> 0x28);
      uVar337 = (ushort)((ulong)uVar282 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar417._0_10_ >> 0x48);
      uVar341 = auVar417._10_2_ >> 8;
      uVar343 = auVar422._12_2_ >> 8;
      uVar345 = auVar427._14_2_ >> 8;
      bVar107 = (uVar431 != 0) * (uVar431 < 0x100) * cVar10 - (0xff < uVar431);
      cVar6 = (uVar437 != 0) * (uVar437 < 0x100) * cVar18 - (0xff < uVar437);
      uVar508 = CONCAT13(cVar6,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar16 -
                                        (0xff < uVar434),
                                        CONCAT11(bVar107,(uVar410 != 0) * (uVar410 < 0x100) * bVar3
                                                         - (0xff < uVar410))));
      cVar7 = (uVar443 != 0) * (uVar443 < 0x100) * cVar15 - (0xff < uVar443);
      uVar509 = CONCAT15(cVar7,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar17 -
                                        (0xff < uVar440),uVar508));
      cVar9 = (uVar449 != 0) * (uVar449 < 0x100) * cVar13 - (0xff < uVar449);
      uVar510 = CONCAT17(cVar9,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar14 -
                                        (0xff < uVar446),uVar509));
      cVar10 = (uVar332 != 0) * (uVar332 < 0x100) * cVar52 - (0xff < uVar332);
      auVar513._0_10_ =
           CONCAT19(cVar10,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar11 - (0xff < uVar320),
                                    uVar510));
      auVar513[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar24 - (0xff < uVar334);
      cVar17 = (uVar337 != 0) * (uVar337 < 0x100) * cVar23 - (0xff < uVar337);
      auVar513[0xb] = cVar17;
      auVar517[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar22 - (0xff < uVar339);
      auVar517._0_12_ = auVar513;
      cVar18 = (uVar341 != 0) * (uVar341 < 0x100) * cVar12 - (0xff < uVar341);
      auVar517[0xd] = cVar18;
      auVar521[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar21 - (0xff < uVar343);
      auVar521._0_14_ = auVar517;
      cVar16 = (uVar345 != 0) * (uVar345 < 0x100) * cVar20 - (0xff < uVar345);
      auVar521[0xf] = cVar16;
      auVar303 = auVar501 & _DAT_0010a570;
      auVar208 = auVar267 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar3 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar22 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar280 = CONCAT13(cVar22,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar3,(0 < sVar322) * (sVar322 < 0x100) *
                                                        auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar21 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar281 = CONCAT15(cVar21,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar280));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar20 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar282 = CONCAT17(cVar20,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar281));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar15 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar418._0_10_ =
           CONCAT19(cVar15,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar282));
      sVar322 = auVar208._4_2_;
      auVar418[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar12 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar418[0xb] = cVar12;
      sVar322 = auVar208._8_2_;
      auVar423[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar423._0_12_ = auVar418;
      sVar322 = auVar208._10_2_;
      cVar13 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar423[0xd] = cVar13;
      sVar322 = auVar208._12_2_;
      auVar428[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar428._0_14_ = auVar423;
      sVar322 = auVar208._14_2_;
      cVar14 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar428[0xf] = cVar14;
      auVar303 = auVar238 & _DAT_0010a570;
      auVar208 = auVar308 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar11 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar23 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar249 = CONCAT13(cVar23,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar11,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar24 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar251 = CONCAT15(cVar24,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar249));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar52 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar253 = CONCAT17(cVar52,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar251));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar113 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar392._0_10_ =
           CONCAT19(cVar113,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                     (0xff < sVar322),uVar253));
      sVar322 = auVar208._4_2_;
      auVar392[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar111 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar392[0xb] = cVar111;
      sVar322 = auVar208._8_2_;
      auVar397[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar397._0_12_ = auVar392;
      sVar322 = auVar208._10_2_;
      cVar110 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar397[0xd] = cVar110;
      sVar322 = auVar208._12_2_;
      auVar402[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar402._0_14_ = auVar397;
      sVar322 = auVar208._14_2_;
      cVar109 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar402[0xf] = cVar109;
      auVar303 = auVar209 & _DAT_0010a570;
      auVar208 = auVar521 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar115 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar120 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar413 = CONCAT13(cVar120,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                          (0xff < sVar333),
                                          CONCAT11(bVar115,(0 < sVar322) * (sVar322 < 0x100) *
                                                           auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar119 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar414 = CONCAT15(cVar119,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                          (0xff < sVar322),uVar413));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar108 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar415 = CONCAT17(cVar108,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                          (0xff < sVar322),uVar414));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar121 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar468._0_10_ =
           CONCAT19(cVar121,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                     (0xff < sVar322),uVar415));
      sVar322 = auVar208._4_2_;
      auVar468[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar118 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar468[0xb] = cVar118;
      sVar322 = auVar208._8_2_;
      auVar473[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar473._0_12_ = auVar468;
      sVar322 = auVar208._10_2_;
      cVar117 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar473[0xd] = cVar117;
      sVar322 = auVar208._12_2_;
      auVar478[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar478._0_14_ = auVar473;
      sVar322 = auVar208._14_2_;
      cVar116 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar478[0xf] = cVar116;
      uVar410 = (ushort)bVar19;
      uVar431 = (ushort)((uint)uVar453 >> 0x18);
      uVar434 = (ushort)((uint6)uVar454 >> 0x28);
      uVar437 = (ushort)((ulong)uVar455 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar496._0_10_ >> 0x48);
      uVar443 = auVar496._10_2_ >> 8;
      uVar446 = auVar498._12_2_ >> 8;
      uVar449 = auVar501._14_2_ >> 8;
      uVar320 = (ushort)bVar51;
      uVar332 = (ushort)((uint)uVar248 >> 0x18);
      uVar334 = (ushort)((uint6)uVar250 >> 0x28);
      uVar337 = (ushort)((ulong)uVar252 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar255._0_10_ >> 0x48);
      uVar341 = auVar255._10_2_ >> 8;
      uVar343 = auVar261._12_2_ >> 8;
      uVar345 = auVar267._14_2_ >> 8;
      bVar123 = (uVar431 != 0) * (uVar431 < 0x100) * cVar25 - (0xff < uVar431);
      cVar25 = (uVar437 != 0) * (uVar437 < 0x100) * cVar53 - (0xff < uVar437);
      uVar453 = CONCAT13(cVar25,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar26 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar123,(uVar410 != 0) * (uVar410 < 0x100) *
                                                          bVar19 - (0xff < uVar410))));
      cVar26 = (uVar443 != 0) * (uVar443 < 0x100) * cVar55 - (0xff < uVar443);
      uVar454 = CONCAT15(cVar26,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar54 -
                                         (0xff < uVar440),uVar453));
      cVar53 = (uVar449 != 0) * (uVar449 < 0x100) * cVar57 - (0xff < uVar449);
      uVar455 = CONCAT17(cVar53,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar56 -
                                         (0xff < uVar446),uVar454));
      cVar54 = (uVar332 != 0) * (uVar332 < 0x100) * cVar58 - (0xff < uVar332);
      auVar497._0_10_ =
           CONCAT19(cVar54,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar51 - (0xff < uVar320),
                                    uVar455));
      auVar497[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar63 - (0xff < uVar334);
      cVar55 = (uVar337 != 0) * (uVar337 < 0x100) * cVar62 - (0xff < uVar337);
      auVar497[0xb] = cVar55;
      auVar499[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar61 - (0xff < uVar339);
      auVar499._0_12_ = auVar497;
      cVar56 = (uVar341 != 0) * (uVar341 < 0x100) * cVar64 - (0xff < uVar341);
      auVar499[0xd] = cVar56;
      auVar502[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar66 - (0xff < uVar343);
      auVar502._0_14_ = auVar499;
      cVar57 = (uVar345 != 0) * (uVar345 < 0x100) * cVar65 - (0xff < uVar345);
      auVar502[0xf] = cVar57;
      uVar320 = (ushort)bVar59;
      uVar332 = (ushort)((uint)uVar222 >> 0x18);
      uVar334 = (ushort)((uint6)uVar223 >> 0x28);
      uVar337 = (ushort)((ulong)uVar224 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar225._0_10_ >> 0x48);
      uVar341 = auVar225._10_2_ >> 8;
      uVar343 = auVar231._12_2_ >> 8;
      uVar345 = auVar238._14_2_ >> 8;
      uVar410 = (ushort)bVar67;
      uVar431 = (ushort)((uint)uVar191 >> 0x18);
      uVar434 = (ushort)((uint6)uVar193 >> 0x28);
      uVar437 = (ushort)((ulong)uVar195 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar284._0_10_ >> 0x48);
      uVar443 = auVar284._10_2_ >> 8;
      uVar446 = auVar290._12_2_ >> 8;
      uVar449 = auVar308._14_2_ >> 8;
      bVar19 = (uVar332 != 0) * (uVar332 < 0x100) * cVar60 - (0xff < uVar332);
      cVar61 = (uVar337 != 0) * (uVar337 < 0x100) * cVar69 - (0xff < uVar337);
      uVar222 = CONCAT13(cVar61,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar68 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar19,(uVar320 != 0) * (uVar320 < 0x100) * bVar59
                                                         - (0xff < uVar320))));
      cVar63 = (uVar341 != 0) * (uVar341 < 0x100) * cVar71 - (0xff < uVar341);
      uVar223 = CONCAT15(cVar63,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar70 -
                                         (0xff < uVar339),uVar222));
      cVar62 = (uVar345 != 0) * (uVar345 < 0x100) * cVar73 - (0xff < uVar345);
      uVar224 = CONCAT17(cVar62,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar72 -
                                         (0xff < uVar343),uVar223));
      cVar58 = (uVar431 != 0) * (uVar431 < 0x100) * cVar74 - (0xff < uVar431);
      auVar226._0_10_ =
           CONCAT19(cVar58,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar67 - (0xff < uVar410),
                                    uVar224));
      auVar226[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar125 - (0xff < uVar434);
      cVar64 = (uVar437 != 0) * (uVar437 < 0x100) * cVar104 - (0xff < uVar437);
      auVar226[0xb] = cVar64;
      auVar232[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar103 - (0xff < uVar440);
      auVar232._0_12_ = auVar226;
      cVar66 = (uVar443 != 0) * (uVar443 < 0x100) * cVar102 - (0xff < uVar443);
      auVar232[0xd] = cVar66;
      auVar239[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar101 - (0xff < uVar446);
      auVar239._0_14_ = auVar232;
      cVar65 = (uVar449 != 0) * (uVar449 < 0x100) * cVar100 - (0xff < uVar449);
      auVar239[0xf] = cVar65;
      uVar320 = (ushort)bVar99;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar197._0_10_ >> 0x48);
      uVar341 = auVar197._10_2_ >> 8;
      uVar343 = auVar203._12_2_ >> 8;
      uVar345 = auVar209._14_2_ >> 8;
      uVar410 = (ushort)bVar107;
      uVar431 = (ushort)((uint)uVar508 >> 0x18);
      uVar434 = (ushort)((uint6)uVar509 >> 0x28);
      uVar437 = (ushort)((ulong)uVar510 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar513._0_10_ >> 0x48);
      uVar443 = auVar513._10_2_ >> 8;
      uVar446 = auVar517._12_2_ >> 8;
      uVar449 = auVar521._14_2_ >> 8;
      bVar51 = (uVar332 != 0) * (uVar332 < 0x100) * cVar112 - (0xff < uVar332);
      cVar60 = (uVar337 != 0) * (uVar337 < 0x100) * cVar105 - (0xff < uVar337);
      uVar190 = CONCAT13(cVar60,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar106 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar51,(uVar320 != 0) * (uVar320 < 0x100) * bVar99
                                                         - (0xff < uVar320))));
      cVar4 = (uVar341 != 0) * (uVar341 < 0x100) * cVar4 - (0xff < uVar341);
      uVar192 = CONCAT15(cVar4,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar114 -
                                        (0xff < uVar339),uVar190));
      cVar5 = (uVar345 != 0) * (uVar345 < 0x100) * cVar5 - (0xff < uVar345);
      uVar194 = CONCAT17(cVar5,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar8 -
                                        (0xff < uVar343),uVar192));
      cVar6 = (uVar431 != 0) * (uVar431 < 0x100) * cVar6 - (0xff < uVar431);
      auVar198._0_10_ =
           CONCAT19(cVar6,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar107 - (0xff < uVar410),
                                   uVar194));
      auVar198[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar7 - (0xff < uVar434);
      cVar7 = (uVar437 != 0) * (uVar437 < 0x100) * cVar9 - (0xff < uVar437);
      auVar198[0xb] = cVar7;
      auVar204[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar10 - (0xff < uVar440);
      auVar204._0_12_ = auVar198;
      cVar8 = (uVar443 != 0) * (uVar443 < 0x100) * cVar17 - (0xff < uVar443);
      auVar204[0xd] = cVar8;
      auVar210[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar18 - (0xff < uVar446);
      auVar210._0_14_ = auVar204;
      cVar9 = (uVar449 != 0) * (uVar449 < 0x100) * cVar16 - (0xff < uVar449);
      auVar210[0xf] = cVar9;
      auVar208 = auVar428 & _DAT_0010a570;
      auVar303 = auVar402 & _DAT_0010a570;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar59 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar16 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar248 = CONCAT13(cVar16,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar59,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar69 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar250 = CONCAT15(cVar69,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                         (0xff < sVar322),uVar248));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar68 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar252 = CONCAT17(cVar68,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                         (0xff < sVar322),uVar250));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar70 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar256._0_10_ =
           CONCAT19(cVar70,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                    (0xff < sVar322),uVar252));
      sVar322 = auVar303._4_2_;
      auVar256[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar10 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar256[0xb] = cVar10;
      sVar322 = auVar303._8_2_;
      auVar262[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar262._0_12_ = auVar256;
      sVar322 = auVar303._10_2_;
      cVar17 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar262[0xd] = cVar17;
      sVar322 = auVar303._12_2_;
      auVar268[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar268._0_14_ = auVar262;
      sVar322 = auVar303._14_2_;
      cVar18 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar268[0xf] = cVar18;
      auVar303 = auVar478 & _DAT_0010a570;
      auVar208 = auVar502 & _DAT_0010a570;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar67 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar71 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar508 = CONCAT13(cVar71,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar67,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar72 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar509 = CONCAT15(cVar72,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar508));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar73 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar510 = CONCAT17(cVar73,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar509));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar74 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar514._0_10_ =
           CONCAT19(cVar74,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar510));
      sVar322 = auVar208._4_2_;
      auVar514[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar100 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar514[0xb] = cVar100;
      sVar322 = auVar208._8_2_;
      auVar518[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar518._0_12_ = auVar514;
      sVar322 = auVar208._10_2_;
      cVar101 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar518[0xd] = cVar101;
      sVar322 = auVar208._12_2_;
      auVar522[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar522._0_14_ = auVar518;
      sVar322 = auVar208._14_2_;
      cVar102 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar522[0xf] = cVar102;
      auVar208 = auVar239 & _DAT_0010a570;
      auVar303 = auVar210 & _DAT_0010a570;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar99 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar122 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar191 = CONCAT13(cVar122,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                          (0xff < sVar333),
                                          CONCAT11(bVar99,(0 < sVar322) * (sVar322 < 0x100) *
                                                          auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar114 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar193 = CONCAT15(cVar114,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                          (0xff < sVar322),uVar191));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar112 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar195 = CONCAT17(cVar112,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                          (0xff < sVar322),uVar193));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar103 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar285._0_10_ =
           CONCAT19(cVar103,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                     (0xff < sVar322),uVar195));
      sVar322 = auVar303._4_2_;
      auVar285[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar106 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar285[0xb] = cVar106;
      sVar322 = auVar303._8_2_;
      auVar291[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar291._0_12_ = auVar285;
      sVar322 = auVar303._10_2_;
      cVar105 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar291[0xd] = cVar105;
      sVar322 = auVar303._12_2_;
      auVar309[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar309._0_14_ = auVar291;
      sVar322 = auVar303._14_2_;
      cVar104 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar309[0xf] = cVar104;
      uVar410 = (ushort)bVar3;
      uVar431 = (ushort)((uint)uVar280 >> 0x18);
      uVar434 = (ushort)((uint6)uVar281 >> 0x28);
      uVar437 = (ushort)((ulong)uVar282 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar418._0_10_ >> 0x48);
      uVar443 = auVar418._10_2_ >> 8;
      uVar446 = auVar423._12_2_ >> 8;
      uVar449 = auVar428._14_2_ >> 8;
      uVar320 = (ushort)bVar11;
      uVar332 = (ushort)((uint)uVar249 >> 0x18);
      uVar334 = (ushort)((uint6)uVar251 >> 0x28);
      uVar337 = (ushort)((ulong)uVar253 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar392._0_10_ >> 0x48);
      uVar341 = auVar392._10_2_ >> 8;
      uVar343 = auVar397._12_2_ >> 8;
      uVar345 = auVar402._14_2_ >> 8;
      bVar107 = (uVar431 != 0) * (uVar431 < 0x100) * cVar22 - (0xff < uVar431);
      cVar20 = (uVar437 != 0) * (uVar437 < 0x100) * cVar20 - (0xff < uVar437);
      uVar249 = CONCAT13(cVar20,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar21 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar107,(uVar410 != 0) * (uVar410 < 0x100) * bVar3
                                                          - (0xff < uVar410))));
      cVar12 = (uVar443 != 0) * (uVar443 < 0x100) * cVar12 - (0xff < uVar443);
      uVar251 = CONCAT15(cVar12,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar15 -
                                         (0xff < uVar440),uVar249));
      cVar15 = (uVar449 != 0) * (uVar449 < 0x100) * cVar14 - (0xff < uVar449);
      uVar253 = CONCAT17(cVar15,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar13 -
                                         (0xff < uVar446),uVar251));
      cVar14 = (uVar332 != 0) * (uVar332 < 0x100) * cVar23 - (0xff < uVar332);
      auVar419._0_10_ =
           CONCAT19(cVar14,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar11 - (0xff < uVar320),
                                    uVar253));
      auVar419[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar24 - (0xff < uVar334);
      cVar13 = (uVar337 != 0) * (uVar337 < 0x100) * cVar52 - (0xff < uVar337);
      auVar419[0xb] = cVar13;
      auVar424[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar113 - (0xff < uVar339);
      auVar424._0_12_ = auVar419;
      cVar21 = (uVar341 != 0) * (uVar341 < 0x100) * cVar111 - (0xff < uVar341);
      auVar424[0xd] = cVar21;
      auVar429[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar110 - (0xff < uVar343);
      auVar429._0_14_ = auVar424;
      cVar22 = (uVar345 != 0) * (uVar345 < 0x100) * cVar109 - (0xff < uVar345);
      auVar429[0xf] = cVar22;
      uVar320 = (ushort)bVar115;
      uVar332 = (ushort)((uint)uVar413 >> 0x18);
      uVar334 = (ushort)((uint6)uVar414 >> 0x28);
      uVar337 = (ushort)((ulong)uVar415 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar468._0_10_ >> 0x48);
      uVar341 = auVar468._10_2_ >> 8;
      uVar343 = auVar473._12_2_ >> 8;
      uVar345 = auVar478._14_2_ >> 8;
      uVar410 = (ushort)bVar123;
      uVar431 = (ushort)((uint)uVar453 >> 0x18);
      uVar434 = (ushort)((uint6)uVar454 >> 0x28);
      uVar437 = (ushort)((ulong)uVar455 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar497._0_10_ >> 0x48);
      uVar443 = auVar497._10_2_ >> 8;
      uVar446 = auVar499._12_2_ >> 8;
      uVar449 = auVar502._14_2_ >> 8;
      bVar3 = (uVar332 != 0) * (uVar332 < 0x100) * cVar120 - (0xff < uVar332);
      cVar110 = (uVar337 != 0) * (uVar337 < 0x100) * cVar108 - (0xff < uVar337);
      uVar280 = CONCAT13(cVar110,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar119 -
                                          (0xff < uVar334),
                                          CONCAT11(bVar3,(uVar320 != 0) * (uVar320 < 0x100) *
                                                         bVar115 - (0xff < uVar320))));
      cVar111 = (uVar341 != 0) * (uVar341 < 0x100) * cVar118 - (0xff < uVar341);
      uVar281 = CONCAT15(cVar111,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar121 -
                                          (0xff < uVar339),uVar280));
      cVar113 = (uVar345 != 0) * (uVar345 < 0x100) * cVar116 - (0xff < uVar345);
      uVar282 = CONCAT17(cVar113,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar117 -
                                          (0xff < uVar343),uVar281));
      cVar52 = (uVar431 != 0) * (uVar431 < 0x100) * cVar25 - (0xff < uVar431);
      auVar469._0_10_ =
           CONCAT19(cVar52,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar123 - (0xff < uVar410),
                                    uVar282));
      auVar469[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar26 - (0xff < uVar434);
      cVar23 = (uVar437 != 0) * (uVar437 < 0x100) * cVar53 - (0xff < uVar437);
      auVar469[0xb] = cVar23;
      auVar474[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar54 - (0xff < uVar440);
      auVar474._0_12_ = auVar469;
      cVar25 = (uVar443 != 0) * (uVar443 < 0x100) * cVar55 - (0xff < uVar443);
      auVar474[0xd] = cVar25;
      auVar479[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar56 - (0xff < uVar446);
      auVar479._0_14_ = auVar474;
      cVar24 = (uVar449 != 0) * (uVar449 < 0x100) * cVar57 - (0xff < uVar449);
      auVar479[0xf] = cVar24;
      uVar410 = (ushort)bVar19;
      uVar431 = (ushort)((uint)uVar222 >> 0x18);
      uVar434 = (ushort)((uint6)uVar223 >> 0x28);
      uVar437 = (ushort)((ulong)uVar224 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar226._0_10_ >> 0x48);
      uVar443 = auVar226._10_2_ >> 8;
      uVar446 = auVar232._12_2_ >> 8;
      uVar449 = auVar239._14_2_ >> 8;
      uVar320 = (ushort)bVar51;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar198._0_10_ >> 0x48);
      uVar341 = auVar198._10_2_ >> 8;
      uVar343 = auVar204._12_2_ >> 8;
      uVar345 = auVar210._14_2_ >> 8;
      bVar11 = (uVar431 != 0) * (uVar431 < 0x100) * cVar61 - (0xff < uVar431);
      cVar26 = (uVar437 != 0) * (uVar437 < 0x100) * cVar62 - (0xff < uVar437);
      uVar190 = CONCAT13(cVar26,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar63 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar11,(uVar410 != 0) * (uVar410 < 0x100) * bVar19
                                                         - (0xff < uVar410))));
      cVar53 = (uVar443 != 0) * (uVar443 < 0x100) * cVar64 - (0xff < uVar443);
      uVar192 = CONCAT15(cVar53,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar58 -
                                         (0xff < uVar440),uVar190));
      cVar54 = (uVar449 != 0) * (uVar449 < 0x100) * cVar65 - (0xff < uVar449);
      uVar194 = CONCAT17(cVar54,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar66 -
                                         (0xff < uVar446),uVar192));
      cVar55 = (uVar332 != 0) * (uVar332 < 0x100) * cVar60 - (0xff < uVar332);
      auVar227._0_10_ =
           CONCAT19(cVar55,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar51 - (0xff < uVar320),
                                    uVar194));
      auVar227[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar4 - (0xff < uVar334);
      cVar5 = (uVar337 != 0) * (uVar337 < 0x100) * cVar5 - (0xff < uVar337);
      auVar227[0xb] = cVar5;
      auVar233[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar6 - (0xff < uVar339);
      auVar233._0_12_ = auVar227;
      cVar6 = (uVar341 != 0) * (uVar341 < 0x100) * cVar7 - (0xff < uVar341);
      auVar233[0xd] = cVar6;
      auVar240[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar8 - (0xff < uVar343);
      auVar240._0_14_ = auVar233;
      cVar7 = (uVar345 != 0) * (uVar345 < 0x100) * cVar9 - (0xff < uVar345);
      auVar240[0xf] = cVar7;
      auVar208 = auVar268 & _DAT_0010a570;
      auVar303 = auVar522 & _DAT_0010a570;
      sVar322 = auVar208._0_2_;
      sVar214 = auVar208._2_2_;
      sVar220 = auVar208._4_2_;
      sVar247 = auVar208._6_2_;
      sVar274 = auVar208._8_2_;
      sVar277 = auVar208._10_2_;
      sVar342 = auVar208._12_2_;
      sVar481 = auVar208._14_2_;
      sVar537 = auVar303._0_2_;
      sVar541 = auVar303._2_2_;
      sVar362 = auVar303._4_2_;
      sVar489 = auVar303._6_2_;
      sVar411 = auVar303._8_2_;
      sVar438 = auVar303._10_2_;
      sVar447 = auVar303._12_2_;
      sVar463 = auVar303._14_2_;
      auVar355 = auVar309 & _DAT_0010a570;
      auVar382 = auVar429 & _DAT_0010a570;
      sVar333 = auVar355._0_2_;
      sVar216 = auVar355._2_2_;
      sVar347 = auVar355._4_2_;
      sVar272 = auVar355._6_2_;
      sVar275 = auVar355._8_2_;
      sVar278 = auVar355._10_2_;
      sVar346 = auVar355._12_2_;
      sVar483 = auVar355._14_2_;
      sVar539 = auVar382._0_2_;
      sVar543 = auVar382._2_2_;
      sVar364 = auVar382._4_2_;
      sVar491 = auVar382._6_2_;
      sVar432 = auVar382._8_2_;
      sVar441 = auVar382._10_2_;
      sVar450 = auVar382._12_2_;
      sVar495 = auVar382._14_2_;
      auVar403 = auVar479 & _DAT_0010a570;
      auVar503 = auVar240 & _DAT_0010a570;
      sVar336 = auVar403._0_2_;
      sVar218 = auVar403._2_2_;
      sVar349 = auVar403._4_2_;
      sVar273 = auVar403._6_2_;
      sVar276 = auVar403._8_2_;
      sVar338 = auVar403._10_2_;
      sVar464 = auVar403._12_2_;
      sVar485 = auVar403._14_2_;
      sVar358 = auVar503._0_2_;
      sVar360 = auVar503._2_2_;
      sVar487 = auVar503._4_2_;
      sVar493 = auVar503._6_2_;
      sVar435 = auVar503._8_2_;
      sVar444 = auVar503._10_2_;
      sVar452 = auVar503._12_2_;
      sVar504 = auVar503._14_2_;
      uVar410 = (ushort)bVar59;
      uVar431 = (ushort)((uint)uVar248 >> 0x18);
      uVar434 = (ushort)((uint6)uVar250 >> 0x28);
      uVar437 = (ushort)((ulong)uVar252 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar256._0_10_ >> 0x48);
      uVar443 = auVar256._10_2_ >> 8;
      uVar446 = auVar262._12_2_ >> 8;
      uVar449 = auVar268._14_2_ >> 8;
      uVar507 = (ushort)bVar67;
      uVar523 = (ushort)((uint)uVar508 >> 0x18);
      uVar524 = (ushort)((uint6)uVar509 >> 0x28);
      uVar525 = (ushort)((ulong)uVar510 >> 0x38);
      uVar526 = (ushort)((unkuint10)auVar514._0_10_ >> 0x48);
      uVar527 = auVar514._10_2_ >> 8;
      uVar528 = auVar518._12_2_ >> 8;
      uVar529 = auVar522._14_2_ >> 8;
      uVar279 = (ushort)bVar99;
      uVar313 = (ushort)((uint)uVar191 >> 0x18);
      uVar314 = (ushort)((uint6)uVar193 >> 0x28);
      uVar315 = (ushort)((ulong)uVar195 >> 0x38);
      uVar316 = (ushort)((unkuint10)auVar285._0_10_ >> 0x48);
      uVar317 = auVar285._10_2_ >> 8;
      uVar318 = auVar291._12_2_ >> 8;
      uVar319 = auVar309._14_2_ >> 8;
      uVar412 = (ushort)bVar107;
      uVar433 = (ushort)((uint)uVar249 >> 0x18);
      uVar436 = (ushort)((uint6)uVar251 >> 0x28);
      uVar439 = (ushort)((ulong)uVar253 >> 0x38);
      uVar442 = (ushort)((unkuint10)auVar419._0_10_ >> 0x48);
      uVar445 = auVar419._10_2_ >> 8;
      uVar448 = auVar424._12_2_ >> 8;
      uVar451 = auVar429._14_2_ >> 8;
      uVar465 = (ushort)bVar3;
      uVar482 = (ushort)((uint)uVar280 >> 0x18);
      uVar484 = (ushort)((uint6)uVar281 >> 0x28);
      uVar486 = (ushort)((ulong)uVar282 >> 0x38);
      uVar488 = (ushort)((unkuint10)auVar469._0_10_ >> 0x48);
      uVar490 = auVar469._10_2_ >> 8;
      uVar492 = auVar474._12_2_ >> 8;
      uVar494 = auVar479._14_2_ >> 8;
      uVar320 = (ushort)bVar11;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar227._0_10_ >> 0x48);
      uVar341 = auVar227._10_2_ >> 8;
      uVar343 = auVar233._12_2_ >> 8;
      uVar345 = auVar240._14_2_ >> 8;
      puVar1 = puVar183 + uVar186;
      *puVar1 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0] - (0xff < sVar322);
      puVar1[1] = (0 < sVar214) * (sVar214 < 0x100) * auVar208[2] - (0xff < sVar214);
      puVar1[2] = (0 < sVar220) * (sVar220 < 0x100) * auVar208[4] - (0xff < sVar220);
      puVar1[3] = (0 < sVar247) * (sVar247 < 0x100) * auVar208[6] - (0xff < sVar247);
      puVar1[4] = (0 < sVar274) * (sVar274 < 0x100) * auVar208[8] - (0xff < sVar274);
      puVar1[5] = (0 < sVar277) * (sVar277 < 0x100) * auVar208[10] - (0xff < sVar277);
      puVar1[6] = (0 < sVar342) * (sVar342 < 0x100) * auVar208[0xc] - (0xff < sVar342);
      puVar1[7] = (0 < sVar481) * (sVar481 < 0x100) * auVar208[0xe] - (0xff < sVar481);
      puVar1[8] = (0 < sVar537) * (sVar537 < 0x100) * auVar303[0] - (0xff < sVar537);
      puVar1[9] = (0 < sVar541) * (sVar541 < 0x100) * auVar303[2] - (0xff < sVar541);
      puVar1[10] = (0 < sVar362) * (sVar362 < 0x100) * auVar303[4] - (0xff < sVar362);
      puVar1[0xb] = (0 < sVar489) * (sVar489 < 0x100) * auVar303[6] - (0xff < sVar489);
      puVar1[0xc] = (0 < sVar411) * (sVar411 < 0x100) * auVar303[8] - (0xff < sVar411);
      puVar1[0xd] = (0 < sVar438) * (sVar438 < 0x100) * auVar303[10] - (0xff < sVar438);
      puVar1[0xe] = (0 < sVar447) * (sVar447 < 0x100) * auVar303[0xc] - (0xff < sVar447);
      puVar1[0xf] = (0 < sVar463) * (sVar463 < 0x100) * auVar303[0xe] - (0xff < sVar463);
      puVar1 = puVar183 + (ulong)uVar186 + 0x10;
      *puVar1 = (0 < sVar333) * (sVar333 < 0x100) * auVar355[0] - (0xff < sVar333);
      puVar1[1] = (0 < sVar216) * (sVar216 < 0x100) * auVar355[2] - (0xff < sVar216);
      puVar1[2] = (0 < sVar347) * (sVar347 < 0x100) * auVar355[4] - (0xff < sVar347);
      puVar1[3] = (0 < sVar272) * (sVar272 < 0x100) * auVar355[6] - (0xff < sVar272);
      puVar1[4] = (0 < sVar275) * (sVar275 < 0x100) * auVar355[8] - (0xff < sVar275);
      puVar1[5] = (0 < sVar278) * (sVar278 < 0x100) * auVar355[10] - (0xff < sVar278);
      puVar1[6] = (0 < sVar346) * (sVar346 < 0x100) * auVar355[0xc] - (0xff < sVar346);
      puVar1[7] = (0 < sVar483) * (sVar483 < 0x100) * auVar355[0xe] - (0xff < sVar483);
      puVar1[8] = (0 < sVar539) * (sVar539 < 0x100) * auVar382[0] - (0xff < sVar539);
      puVar1[9] = (0 < sVar543) * (sVar543 < 0x100) * auVar382[2] - (0xff < sVar543);
      puVar1[10] = (0 < sVar364) * (sVar364 < 0x100) * auVar382[4] - (0xff < sVar364);
      puVar1[0xb] = (0 < sVar491) * (sVar491 < 0x100) * auVar382[6] - (0xff < sVar491);
      puVar1[0xc] = (0 < sVar432) * (sVar432 < 0x100) * auVar382[8] - (0xff < sVar432);
      puVar1[0xd] = (0 < sVar441) * (sVar441 < 0x100) * auVar382[10] - (0xff < sVar441);
      puVar1[0xe] = (0 < sVar450) * (sVar450 < 0x100) * auVar382[0xc] - (0xff < sVar450);
      puVar1[0xf] = (0 < sVar495) * (sVar495 < 0x100) * auVar382[0xe] - (0xff < sVar495);
      puVar1 = puVar183 + (ulong)uVar186 + 0x20;
      *puVar1 = (0 < sVar336) * (sVar336 < 0x100) * auVar403[0] - (0xff < sVar336);
      puVar1[1] = (0 < sVar218) * (sVar218 < 0x100) * auVar403[2] - (0xff < sVar218);
      puVar1[2] = (0 < sVar349) * (sVar349 < 0x100) * auVar403[4] - (0xff < sVar349);
      puVar1[3] = (0 < sVar273) * (sVar273 < 0x100) * auVar403[6] - (0xff < sVar273);
      puVar1[4] = (0 < sVar276) * (sVar276 < 0x100) * auVar403[8] - (0xff < sVar276);
      puVar1[5] = (0 < sVar338) * (sVar338 < 0x100) * auVar403[10] - (0xff < sVar338);
      puVar1[6] = (0 < sVar464) * (sVar464 < 0x100) * auVar403[0xc] - (0xff < sVar464);
      puVar1[7] = (0 < sVar485) * (sVar485 < 0x100) * auVar403[0xe] - (0xff < sVar485);
      puVar1[8] = (0 < sVar358) * (sVar358 < 0x100) * auVar503[0] - (0xff < sVar358);
      puVar1[9] = (0 < sVar360) * (sVar360 < 0x100) * auVar503[2] - (0xff < sVar360);
      puVar1[10] = (0 < sVar487) * (sVar487 < 0x100) * auVar503[4] - (0xff < sVar487);
      puVar1[0xb] = (0 < sVar493) * (sVar493 < 0x100) * auVar503[6] - (0xff < sVar493);
      puVar1[0xc] = (0 < sVar435) * (sVar435 < 0x100) * auVar503[8] - (0xff < sVar435);
      puVar1[0xd] = (0 < sVar444) * (sVar444 < 0x100) * auVar503[10] - (0xff < sVar444);
      puVar1[0xe] = (0 < sVar452) * (sVar452 < 0x100) * auVar503[0xc] - (0xff < sVar452);
      puVar1[0xf] = (0 < sVar504) * (sVar504 < 0x100) * auVar503[0xe] - (0xff < sVar504);
      puVar1 = puVar183 + (ulong)uVar186 + 0x30;
      *puVar1 = (uVar410 != 0) * (uVar410 < 0x100) * bVar59 - (0xff < uVar410);
      puVar1[1] = (uVar431 != 0) * (uVar431 < 0x100) * cVar16 - (0xff < uVar431);
      puVar1[2] = (uVar434 != 0) * (uVar434 < 0x100) * cVar69 - (0xff < uVar434);
      puVar1[3] = (uVar437 != 0) * (uVar437 < 0x100) * cVar68 - (0xff < uVar437);
      puVar1[4] = (uVar440 != 0) * (uVar440 < 0x100) * cVar70 - (0xff < uVar440);
      puVar1[5] = (uVar443 != 0) * (uVar443 < 0x100) * cVar10 - (0xff < uVar443);
      puVar1[6] = (uVar446 != 0) * (uVar446 < 0x100) * cVar17 - (0xff < uVar446);
      puVar1[7] = (uVar449 != 0) * (uVar449 < 0x100) * cVar18 - (0xff < uVar449);
      puVar1[8] = (uVar507 != 0) * (uVar507 < 0x100) * bVar67 - (0xff < uVar507);
      puVar1[9] = (uVar523 != 0) * (uVar523 < 0x100) * cVar71 - (0xff < uVar523);
      puVar1[10] = (uVar524 != 0) * (uVar524 < 0x100) * cVar72 - (0xff < uVar524);
      puVar1[0xb] = (uVar525 != 0) * (uVar525 < 0x100) * cVar73 - (0xff < uVar525);
      puVar1[0xc] = (uVar526 != 0) * (uVar526 < 0x100) * cVar74 - (0xff < uVar526);
      puVar1[0xd] = (uVar527 != 0) * (uVar527 < 0x100) * cVar100 - (0xff < uVar527);
      puVar1[0xe] = (uVar528 != 0) * (uVar528 < 0x100) * cVar101 - (0xff < uVar528);
      puVar1[0xf] = (uVar529 != 0) * (uVar529 < 0x100) * cVar102 - (0xff < uVar529);
      puVar1 = puVar183 + (ulong)uVar186 + 0x40;
      *puVar1 = (uVar279 != 0) * (uVar279 < 0x100) * bVar99 - (0xff < uVar279);
      puVar1[1] = (uVar313 != 0) * (uVar313 < 0x100) * cVar122 - (0xff < uVar313);
      puVar1[2] = (uVar314 != 0) * (uVar314 < 0x100) * cVar114 - (0xff < uVar314);
      puVar1[3] = (uVar315 != 0) * (uVar315 < 0x100) * cVar112 - (0xff < uVar315);
      puVar1[4] = (uVar316 != 0) * (uVar316 < 0x100) * cVar103 - (0xff < uVar316);
      puVar1[5] = (uVar317 != 0) * (uVar317 < 0x100) * cVar106 - (0xff < uVar317);
      puVar1[6] = (uVar318 != 0) * (uVar318 < 0x100) * cVar105 - (0xff < uVar318);
      puVar1[7] = (uVar319 != 0) * (uVar319 < 0x100) * cVar104 - (0xff < uVar319);
      puVar1[8] = (uVar412 != 0) * (uVar412 < 0x100) * bVar107 - (0xff < uVar412);
      puVar1[9] = (uVar433 != 0) * (uVar433 < 0x100) * cVar20 - (0xff < uVar433);
      puVar1[10] = (uVar436 != 0) * (uVar436 < 0x100) * cVar12 - (0xff < uVar436);
      puVar1[0xb] = (uVar439 != 0) * (uVar439 < 0x100) * cVar15 - (0xff < uVar439);
      puVar1[0xc] = (uVar442 != 0) * (uVar442 < 0x100) * cVar14 - (0xff < uVar442);
      puVar1[0xd] = (uVar445 != 0) * (uVar445 < 0x100) * cVar13 - (0xff < uVar445);
      puVar1[0xe] = (uVar448 != 0) * (uVar448 < 0x100) * cVar21 - (0xff < uVar448);
      puVar1[0xf] = (uVar451 != 0) * (uVar451 < 0x100) * cVar22 - (0xff < uVar451);
      puVar1 = puVar183 + (ulong)uVar186 + 0x50;
      *puVar1 = (uVar465 != 0) * (uVar465 < 0x100) * bVar3 - (0xff < uVar465);
      puVar1[1] = (uVar482 != 0) * (uVar482 < 0x100) * cVar110 - (0xff < uVar482);
      puVar1[2] = (uVar484 != 0) * (uVar484 < 0x100) * cVar111 - (0xff < uVar484);
      puVar1[3] = (uVar486 != 0) * (uVar486 < 0x100) * cVar113 - (0xff < uVar486);
      puVar1[4] = (uVar488 != 0) * (uVar488 < 0x100) * cVar52 - (0xff < uVar488);
      puVar1[5] = (uVar490 != 0) * (uVar490 < 0x100) * cVar23 - (0xff < uVar490);
      puVar1[6] = (uVar492 != 0) * (uVar492 < 0x100) * cVar25 - (0xff < uVar492);
      puVar1[7] = (uVar494 != 0) * (uVar494 < 0x100) * cVar24 - (0xff < uVar494);
      puVar1[8] = (uVar320 != 0) * (uVar320 < 0x100) * bVar11 - (0xff < uVar320);
      puVar1[9] = (uVar332 != 0) * (uVar332 < 0x100) * cVar26 - (0xff < uVar332);
      puVar1[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar53 - (0xff < uVar334);
      puVar1[0xb] = (uVar337 != 0) * (uVar337 < 0x100) * cVar54 - (0xff < uVar337);
      puVar1[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar55 - (0xff < uVar339);
      puVar1[0xd] = (uVar341 != 0) * (uVar341 < 0x100) * cVar5 - (0xff < uVar341);
      puVar1[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar6 - (0xff < uVar343);
      puVar1[0xf] = (uVar345 != 0) * (uVar345 < 0x100) * cVar7 - (0xff < uVar345);
      uVar190 = CONCAT13(cVar28,CONCAT12((0 < sVar538) * (sVar538 < 0x100) * (char)sVar538 -
                                         (0xff < sVar538),
                                         CONCAT11(bVar27,(0 < sVar530) * (sVar530 < 0x100) *
                                                         (char)sVar530 - (0xff < sVar530))));
      uVar192 = CONCAT15(cVar29,CONCAT14((0 < sVar540) * (sVar540 < 0x100) * (char)sVar540 -
                                         (0xff < sVar540),uVar190));
      uVar194 = CONCAT17(cVar30,CONCAT16((0 < sVar542) * (sVar542 < 0x100) * (char)sVar542 -
                                         (0xff < sVar542),uVar192));
      Var155 = CONCAT19(cVar31,CONCAT18((0 < sVar348) * (sVar348 < 0x100) * (char)sVar348 -
                                        (0xff < sVar348),uVar194));
      auVar156[10] = (0 < sVar359) * (sVar359 < 0x100) * (char)sVar359 - (0xff < sVar359);
      auVar156._0_10_ = Var155;
      auVar156[0xb] = cVar32;
      auVar157[0xc] = (0 < sVar361) * (sVar361 < 0x100) * (char)sVar361 - (0xff < sVar361);
      auVar157._0_12_ = auVar156;
      auVar157[0xd] = cVar33;
      auVar208[0xe] = (0 < sVar363) * (sVar363 < 0x100) * (char)sVar363 - (0xff < sVar363);
      auVar208._0_14_ = auVar157;
      auVar208[0xf] = cVar34;
      auVar355 = auVar208 & auVar462;
      auVar303 = auVar384 & auVar462;
      sVar322 = auVar355._0_2_;
      sVar333 = auVar355._2_2_;
      bVar3 = (0 < sVar333) * (sVar333 < 0x100) * auVar355[2] - (0xff < sVar333);
      sVar333 = auVar355._4_2_;
      sVar336 = auVar355._6_2_;
      cVar4 = (0 < sVar336) * (sVar336 < 0x100) * auVar355[6] - (0xff < sVar336);
      uVar280 = CONCAT13(cVar4,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar355[4] -
                                        (0xff < sVar333),
                                        CONCAT11(bVar3,(0 < sVar322) * (sVar322 < 0x100) *
                                                       auVar355[0] - (0xff < sVar322))));
      sVar322 = auVar355._8_2_;
      sVar333 = auVar355._10_2_;
      cVar10 = (0 < sVar333) * (sVar333 < 0x100) * auVar355[10] - (0xff < sVar333);
      uVar281 = CONCAT15(cVar10,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar355[8] -
                                         (0xff < sVar322),uVar280));
      sVar322 = auVar355._12_2_;
      sVar333 = auVar355._14_2_;
      cVar5 = (0 < sVar333) * (sVar333 < 0x100) * auVar355[0xe] - (0xff < sVar333);
      uVar282 = CONCAT17(cVar5,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar355[0xc] -
                                        (0xff < sVar322),uVar281));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar9 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar286._0_10_ =
           CONCAT19(cVar9,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                   (0xff < sVar322),uVar282));
      sVar322 = auVar303._4_2_;
      auVar286[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar8 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar286[0xb] = cVar8;
      sVar322 = auVar303._8_2_;
      auVar292[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar292._0_12_ = auVar286;
      sVar322 = auVar303._10_2_;
      cVar7 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar292[0xd] = cVar7;
      sVar322 = auVar303._12_2_;
      auVar310[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar310._0_14_ = auVar292;
      sVar322 = auVar303._14_2_;
      cVar6 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar310[0xf] = cVar6;
      uVar222 = CONCAT13(cVar36,CONCAT12((0 < sVar335) * (sVar335 < 0x100) * (char)sVar335 -
                                         (0xff < sVar335),
                                         CONCAT11(bVar35,(0 < sVar321) * (sVar321 < 0x100) *
                                                         (char)sVar321 - (0xff < sVar321))));
      uVar223 = CONCAT15(cVar37,CONCAT14((0 < sVar340) * (sVar340 < 0x100) * (char)sVar340 -
                                         (0xff < sVar340),uVar222));
      uVar224 = CONCAT17(cVar38,CONCAT16((0 < sVar344) * (sVar344 < 0x100) * (char)sVar344 -
                                         (0xff < sVar344),uVar223));
      Var158 = CONCAT19(cVar39,CONCAT18((0 < sVar189) * (sVar189 < 0x100) * (char)sVar189 -
                                        (0xff < sVar189),uVar224));
      auVar159[10] = (0 < sVar215) * (sVar215 < 0x100) * (char)sVar215 - (0xff < sVar215);
      auVar159._0_10_ = Var158;
      auVar159[0xb] = cVar40;
      auVar160[0xc] = (0 < sVar217) * (sVar217 < 0x100) * (char)sVar217 - (0xff < sVar217);
      auVar160._0_12_ = auVar159;
      auVar160[0xd] = cVar41;
      auVar303[0xe] = (0 < sVar219) * (sVar219 < 0x100) * (char)sVar219 - (0xff < sVar219);
      auVar303._0_14_ = auVar160;
      auVar303[0xf] = cVar42;
      auVar382 = auVar303 & auVar462;
      auVar355 = auVar536 & auVar462;
      sVar322 = auVar382._0_2_;
      sVar333 = auVar382._2_2_;
      bVar11 = (0 < sVar333) * (sVar333 < 0x100) * auVar382[2] - (0xff < sVar333);
      sVar333 = auVar382._4_2_;
      sVar336 = auVar382._6_2_;
      cVar17 = (0 < sVar336) * (sVar336 < 0x100) * auVar382[6] - (0xff < sVar336);
      uVar249 = CONCAT13(cVar17,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar382[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar11,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar382[0] - (0xff < sVar322))));
      sVar322 = auVar382._8_2_;
      sVar333 = auVar382._10_2_;
      cVar18 = (0 < sVar333) * (sVar333 < 0x100) * auVar382[10] - (0xff < sVar333);
      uVar251 = CONCAT15(cVar18,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar382[8] -
                                         (0xff < sVar322),uVar249));
      sVar322 = auVar382._12_2_;
      sVar333 = auVar382._14_2_;
      cVar16 = (0 < sVar333) * (sVar333 < 0x100) * auVar382[0xe] - (0xff < sVar333);
      uVar253 = CONCAT17(cVar16,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar382[0xc] -
                                         (0xff < sVar322),uVar251));
      sVar322 = auVar355._0_2_;
      sVar333 = auVar355._2_2_;
      cVar15 = (0 < sVar333) * (sVar333 < 0x100) * auVar355[2] - (0xff < sVar333);
      auVar257._0_10_ =
           CONCAT19(cVar15,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar355[0] -
                                    (0xff < sVar322),uVar253));
      sVar322 = auVar355._4_2_;
      auVar257[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar355[4] - (0xff < sVar322);
      sVar322 = auVar355._6_2_;
      cVar14 = (0 < sVar322) * (sVar322 < 0x100) * auVar355[6] - (0xff < sVar322);
      auVar257[0xb] = cVar14;
      sVar322 = auVar355._8_2_;
      auVar263[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar355[8] - (0xff < sVar322);
      auVar263._0_12_ = auVar257;
      sVar322 = auVar355._10_2_;
      cVar13 = (0 < sVar322) * (sVar322 < 0x100) * auVar355[10] - (0xff < sVar322);
      auVar263[0xd] = cVar13;
      sVar322 = auVar355._12_2_;
      auVar269[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar355[0xc] - (0xff < sVar322);
      auVar269._0_14_ = auVar263;
      sVar322 = auVar355._14_2_;
      cVar12 = (0 < sVar322) * (sVar322 < 0x100) * auVar355[0xe] - (0xff < sVar322);
      auVar269[0xf] = cVar12;
      uVar248 = CONCAT13(cVar44,CONCAT12((0 < sVar407) * (sVar407 < 0x100) * (char)sVar407 -
                                         (0xff < sVar407),
                                         CONCAT11(bVar43,(0 < sVar387) * (sVar387 < 0x100) *
                                                         (char)sVar387 - (0xff < sVar387))));
      uVar250 = CONCAT15(cVar45,CONCAT14((0 < sVar408) * (sVar408 < 0x100) * (char)sVar408 -
                                         (0xff < sVar408),uVar248));
      uVar252 = CONCAT17(cVar46,CONCAT16((0 < sVar409) * (sVar409 < 0x100) * (char)sVar409 -
                                         (0xff < sVar409),uVar250));
      Var161 = CONCAT19(cVar47,CONCAT18((0 < sVar221) * (sVar221 < 0x100) * (char)sVar221 -
                                        (0xff < sVar221),uVar252));
      auVar162[10] = (0 < sVar244) * (sVar244 < 0x100) * (char)sVar244 - (0xff < sVar244);
      auVar162._0_10_ = Var161;
      auVar162[0xb] = cVar48;
      auVar163[0xc] = (0 < sVar245) * (sVar245 < 0x100) * (char)sVar245 - (0xff < sVar245);
      auVar163._0_12_ = auVar162;
      auVar163[0xd] = cVar49;
      auVar355[0xe] = (0 < sVar246) * (sVar246 < 0x100) * (char)sVar246 - (0xff < sVar246);
      auVar355._0_14_ = auVar163;
      auVar355[0xf] = cVar50;
      auVar382 = auVar355 & auVar462;
      auVar403 = auVar460 & auVar462;
      sVar322 = auVar382._0_2_;
      sVar333 = auVar382._2_2_;
      bVar19 = (0 < sVar333) * (sVar333 < 0x100) * auVar382[2] - (0xff < sVar333);
      sVar333 = auVar382._4_2_;
      sVar336 = auVar382._6_2_;
      cVar23 = (0 < sVar336) * (sVar336 < 0x100) * auVar382[6] - (0xff < sVar336);
      uVar191 = CONCAT13(cVar23,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar382[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar19,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar382[0] - (0xff < sVar322))));
      sVar322 = auVar382._8_2_;
      sVar333 = auVar382._10_2_;
      cVar25 = (0 < sVar333) * (sVar333 < 0x100) * auVar382[10] - (0xff < sVar333);
      uVar193 = CONCAT15(cVar25,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar382[8] -
                                         (0xff < sVar322),uVar191));
      sVar322 = auVar382._12_2_;
      sVar333 = auVar382._14_2_;
      cVar24 = (0 < sVar333) * (sVar333 < 0x100) * auVar382[0xe] - (0xff < sVar333);
      uVar195 = CONCAT17(cVar24,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar382[0xc] -
                                         (0xff < sVar322),uVar193));
      sVar322 = auVar403._0_2_;
      sVar333 = auVar403._2_2_;
      cVar26 = (0 < sVar333) * (sVar333 < 0x100) * auVar403[2] - (0xff < sVar333);
      auVar199._0_10_ =
           CONCAT19(cVar26,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar403[0] -
                                    (0xff < sVar322),uVar195));
      sVar322 = auVar403._4_2_;
      auVar199[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar403[4] - (0xff < sVar322);
      sVar322 = auVar403._6_2_;
      cVar20 = (0 < sVar322) * (sVar322 < 0x100) * auVar403[6] - (0xff < sVar322);
      auVar199[0xb] = cVar20;
      sVar322 = auVar403._8_2_;
      auVar205[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar403[8] - (0xff < sVar322);
      auVar205._0_12_ = auVar199;
      sVar322 = auVar403._10_2_;
      cVar21 = (0 < sVar322) * (sVar322 < 0x100) * auVar403[10] - (0xff < sVar322);
      auVar205[0xd] = cVar21;
      sVar322 = auVar403._12_2_;
      auVar211[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar403[0xc] - (0xff < sVar322);
      auVar211._0_14_ = auVar205;
      sVar322 = auVar403._14_2_;
      cVar22 = (0 < sVar322) * (sVar322 < 0x100) * auVar403[0xe] - (0xff < sVar322);
      auVar211[0xf] = cVar22;
      uVar410 = (ushort)bVar27;
      uVar431 = (ushort)((uint)uVar190 >> 0x18);
      uVar434 = (ushort)((uint6)uVar192 >> 0x28);
      uVar437 = (ushort)((ulong)uVar194 >> 0x38);
      uVar440 = (ushort)((unkuint10)Var155 >> 0x48);
      uVar443 = auVar156._10_2_ >> 8;
      uVar446 = auVar157._12_2_ >> 8;
      uVar449 = auVar208._14_2_ >> 8;
      uVar320 = (ushort)bVar75;
      uVar332 = (ushort)((uint)uVar365 >> 0x18);
      uVar334 = (ushort)((uint6)uVar366 >> 0x28);
      uVar337 = (ushort)((ulong)uVar367 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar368._0_10_ >> 0x48);
      uVar341 = auVar368._10_2_ >> 8;
      uVar343 = auVar371._12_2_ >> 8;
      uVar345 = auVar384._14_2_ >> 8;
      bVar51 = (uVar431 != 0) * (uVar431 < 0x100) * cVar28 - (0xff < uVar431);
      cVar30 = (uVar437 != 0) * (uVar437 < 0x100) * cVar30 - (0xff < uVar437);
      uVar190 = CONCAT13(cVar30,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar29 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar51,(uVar410 != 0) * (uVar410 < 0x100) * bVar27
                                                         - (0xff < uVar410))));
      cVar32 = (uVar443 != 0) * (uVar443 < 0x100) * cVar32 - (0xff < uVar443);
      uVar192 = CONCAT15(cVar32,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar31 -
                                         (0xff < uVar440),uVar190));
      cVar34 = (uVar449 != 0) * (uVar449 < 0x100) * cVar34 - (0xff < uVar449);
      uVar194 = CONCAT17(cVar34,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar33 -
                                         (0xff < uVar446),uVar192));
      cVar33 = (uVar332 != 0) * (uVar332 < 0x100) * cVar76 - (0xff < uVar332);
      auVar393._0_10_ =
           CONCAT19(cVar33,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar75 - (0xff < uVar320),
                                    uVar194));
      auVar393[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar77 - (0xff < uVar334);
      cVar28 = (uVar337 != 0) * (uVar337 < 0x100) * cVar78 - (0xff < uVar337);
      auVar393[0xb] = cVar28;
      auVar398[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar79 - (0xff < uVar339);
      auVar398._0_12_ = auVar393;
      cVar29 = (uVar341 != 0) * (uVar341 < 0x100) * cVar80 - (0xff < uVar341);
      auVar398[0xd] = cVar29;
      auVar404[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar81 - (0xff < uVar343);
      auVar404._0_14_ = auVar398;
      cVar31 = (uVar345 != 0) * (uVar345 < 0x100) * cVar82 - (0xff < uVar345);
      auVar404[0xf] = cVar31;
      uVar320 = (ushort)bVar35;
      uVar332 = (ushort)((uint)uVar222 >> 0x18);
      uVar334 = (ushort)((uint6)uVar223 >> 0x28);
      uVar337 = (ushort)((ulong)uVar224 >> 0x38);
      uVar339 = (ushort)((unkuint10)Var158 >> 0x48);
      uVar341 = auVar159._10_2_ >> 8;
      uVar343 = auVar160._12_2_ >> 8;
      uVar345 = auVar303._14_2_ >> 8;
      uVar410 = (ushort)bVar83;
      uVar431 = (ushort)((uint)uVar531 >> 0x18);
      uVar434 = (ushort)((uint6)uVar532 >> 0x28);
      uVar437 = (ushort)((ulong)uVar533 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar534._0_10_ >> 0x48);
      uVar443 = auVar534._10_2_ >> 8;
      uVar446 = auVar535._12_2_ >> 8;
      uVar449 = auVar536._14_2_ >> 8;
      bVar27 = (uVar332 != 0) * (uVar332 < 0x100) * cVar36 - (0xff < uVar332);
      cVar53 = (uVar337 != 0) * (uVar337 < 0x100) * cVar38 - (0xff < uVar337);
      uVar453 = CONCAT13(cVar53,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar37 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar27,(uVar320 != 0) * (uVar320 < 0x100) * bVar35
                                                         - (0xff < uVar320))));
      cVar52 = (uVar341 != 0) * (uVar341 < 0x100) * cVar40 - (0xff < uVar341);
      uVar454 = CONCAT15(cVar52,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar39 -
                                         (0xff < uVar339),uVar453));
      cVar40 = (uVar345 != 0) * (uVar345 < 0x100) * cVar42 - (0xff < uVar345);
      uVar455 = CONCAT17(cVar40,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar41 -
                                         (0xff < uVar343),uVar454));
      cVar39 = (uVar431 != 0) * (uVar431 < 0x100) * cVar84 - (0xff < uVar431);
      auVar470._0_10_ =
           CONCAT19(cVar39,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar83 - (0xff < uVar410),
                                    uVar455));
      auVar470[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar85 - (0xff < uVar434);
      cVar36 = (uVar437 != 0) * (uVar437 < 0x100) * cVar86 - (0xff < uVar437);
      auVar470[0xb] = cVar36;
      auVar475[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar87 - (0xff < uVar440);
      auVar475._0_12_ = auVar470;
      cVar38 = (uVar443 != 0) * (uVar443 < 0x100) * cVar88 - (0xff < uVar443);
      auVar475[0xd] = cVar38;
      auVar480[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar89 - (0xff < uVar446);
      auVar480._0_14_ = auVar475;
      cVar37 = (uVar449 != 0) * (uVar449 < 0x100) * cVar90 - (0xff < uVar449);
      auVar480[0xf] = cVar37;
      uVar320 = (ushort)bVar43;
      uVar332 = (ushort)((uint)uVar248 >> 0x18);
      uVar334 = (ushort)((uint6)uVar250 >> 0x28);
      uVar337 = (ushort)((ulong)uVar252 >> 0x38);
      uVar339 = (ushort)((unkuint10)Var161 >> 0x48);
      uVar341 = auVar162._10_2_ >> 8;
      uVar343 = auVar163._12_2_ >> 8;
      uVar345 = auVar355._14_2_ >> 8;
      uVar410 = (ushort)bVar91;
      uVar431 = (ushort)((uint)uVar388 >> 0x18);
      uVar434 = (ushort)((uint6)uVar389 >> 0x28);
      uVar437 = (ushort)((ulong)uVar390 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar456._0_10_ >> 0x48);
      uVar443 = auVar456._10_2_ >> 8;
      uVar446 = auVar458._12_2_ >> 8;
      uVar449 = auVar460._14_2_ >> 8;
      bVar35 = (uVar332 != 0) * (uVar332 < 0x100) * cVar44 - (0xff < uVar332);
      cVar41 = (uVar337 != 0) * (uVar337 < 0x100) * cVar46 - (0xff < uVar337);
      uVar248 = CONCAT13(cVar41,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar45 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar35,(uVar320 != 0) * (uVar320 < 0x100) * bVar43
                                                         - (0xff < uVar320))));
      cVar42 = (uVar341 != 0) * (uVar341 < 0x100) * cVar48 - (0xff < uVar341);
      uVar250 = CONCAT15(cVar42,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar47 -
                                         (0xff < uVar339),uVar248));
      cVar47 = (uVar345 != 0) * (uVar345 < 0x100) * cVar50 - (0xff < uVar345);
      uVar252 = CONCAT17(cVar47,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar49 -
                                         (0xff < uVar343),uVar250));
      cVar50 = (uVar431 != 0) * (uVar431 < 0x100) * cVar92 - (0xff < uVar431);
      auVar324._0_10_ =
           CONCAT19(cVar50,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar91 - (0xff < uVar410),
                                    uVar252));
      auVar324[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar93 - (0xff < uVar434);
      cVar49 = (uVar437 != 0) * (uVar437 < 0x100) * cVar94 - (0xff < uVar437);
      auVar324[0xb] = cVar49;
      auVar327[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar95 - (0xff < uVar440);
      auVar327._0_12_ = auVar324;
      cVar48 = (uVar443 != 0) * (uVar443 < 0x100) * cVar96 - (0xff < uVar443);
      auVar327[0xd] = cVar48;
      auVar330[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar97 - (0xff < uVar446);
      auVar330._0_14_ = auVar327;
      cVar46 = (uVar449 != 0) * (uVar449 < 0x100) * cVar98 - (0xff < uVar449);
      auVar330[0xf] = cVar46;
      auVar303 = auVar310 & auVar462;
      auVar208 = auVar269 & auVar462;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar43 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar45 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar365 = CONCAT13(cVar45,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar43,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar57 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar366 = CONCAT15(cVar57,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar365));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar56 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar367 = CONCAT17(cVar56,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar366));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar58 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar369._0_10_ =
           CONCAT19(cVar58,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar367));
      sVar322 = auVar208._4_2_;
      auVar369[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar55 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar369[0xb] = cVar55;
      sVar322 = auVar208._8_2_;
      auVar372[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar372._0_12_ = auVar369;
      sVar322 = auVar208._10_2_;
      cVar54 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar372[0xd] = cVar54;
      sVar322 = auVar208._12_2_;
      auVar385[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar385._0_14_ = auVar372;
      sVar322 = auVar208._14_2_;
      cVar44 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar385[0xf] = cVar44;
      auVar303 = auVar211 & auVar462;
      auVar208 = auVar404 & auVar462;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar59 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar65 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar413 = CONCAT13(cVar65,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar59,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar66 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar414 = CONCAT15(cVar66,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar413));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar64 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar415 = CONCAT17(cVar64,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar414));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar62 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar420._0_10_ =
           CONCAT19(cVar62,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar415));
      sVar322 = auVar208._4_2_;
      auVar420[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar63 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar420[0xb] = cVar63;
      sVar322 = auVar208._8_2_;
      auVar425[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar425._0_12_ = auVar420;
      sVar322 = auVar208._10_2_;
      cVar61 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar425[0xd] = cVar61;
      sVar322 = auVar208._12_2_;
      auVar430[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar430._0_14_ = auVar425;
      sVar322 = auVar208._14_2_;
      cVar60 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar430[0xf] = cVar60;
      auVar208 = auVar480 & auVar462;
      auVar303 = auVar330 & auVar462;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar67 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar68 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar222 = CONCAT13(cVar68,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar67,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar74 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar223 = CONCAT15(cVar74,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                         (0xff < sVar322),uVar222));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar73 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar224 = CONCAT17(cVar73,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                         (0xff < sVar322),uVar223));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar72 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar228._0_10_ =
           CONCAT19(cVar72,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                    (0xff < sVar322),uVar224));
      sVar322 = auVar303._4_2_;
      auVar228[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar71 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar228[0xb] = cVar71;
      sVar322 = auVar303._8_2_;
      auVar234[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar234._0_12_ = auVar228;
      sVar322 = auVar303._10_2_;
      cVar70 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar234[0xd] = cVar70;
      sVar322 = auVar303._12_2_;
      auVar241[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar241._0_14_ = auVar234;
      sVar322 = auVar303._14_2_;
      cVar69 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar241[0xf] = cVar69;
      uVar410 = (ushort)bVar3;
      uVar431 = (ushort)((uint)uVar280 >> 0x18);
      uVar434 = (ushort)((uint6)uVar281 >> 0x28);
      uVar437 = (ushort)((ulong)uVar282 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar286._0_10_ >> 0x48);
      uVar443 = auVar286._10_2_ >> 8;
      uVar446 = auVar292._12_2_ >> 8;
      uVar449 = auVar310._14_2_ >> 8;
      uVar320 = (ushort)bVar11;
      uVar332 = (ushort)((uint)uVar249 >> 0x18);
      uVar334 = (ushort)((uint6)uVar251 >> 0x28);
      uVar337 = (ushort)((ulong)uVar253 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar257._0_10_ >> 0x48);
      uVar341 = auVar257._10_2_ >> 8;
      uVar343 = auVar263._12_2_ >> 8;
      uVar345 = auVar269._14_2_ >> 8;
      bVar75 = (uVar431 != 0) * (uVar431 < 0x100) * cVar4 - (0xff < uVar431);
      cVar4 = (uVar437 != 0) * (uVar437 < 0x100) * cVar5 - (0xff < uVar437);
      uVar249 = CONCAT13(cVar4,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar10 -
                                        (0xff < uVar434),
                                        CONCAT11(bVar75,(uVar410 != 0) * (uVar410 < 0x100) * bVar3 -
                                                        (0xff < uVar410))));
      cVar10 = (uVar443 != 0) * (uVar443 < 0x100) * cVar8 - (0xff < uVar443);
      uVar251 = CONCAT15(cVar10,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar9 -
                                         (0xff < uVar440),uVar249));
      cVar8 = (uVar449 != 0) * (uVar449 < 0x100) * cVar6 - (0xff < uVar449);
      uVar253 = CONCAT17(cVar8,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar7 -
                                        (0xff < uVar446),uVar251));
      cVar9 = (uVar332 != 0) * (uVar332 < 0x100) * cVar17 - (0xff < uVar332);
      auVar287._0_10_ =
           CONCAT19(cVar9,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar11 - (0xff < uVar320),
                                   uVar253));
      auVar287[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar18 - (0xff < uVar334);
      cVar7 = (uVar337 != 0) * (uVar337 < 0x100) * cVar16 - (0xff < uVar337);
      auVar287[0xb] = cVar7;
      auVar293[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar15 - (0xff < uVar339);
      auVar293._0_12_ = auVar287;
      cVar6 = (uVar341 != 0) * (uVar341 < 0x100) * cVar14 - (0xff < uVar341);
      auVar293[0xd] = cVar6;
      auVar311[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar13 - (0xff < uVar343);
      auVar311._0_14_ = auVar293;
      cVar5 = (uVar345 != 0) * (uVar345 < 0x100) * cVar12 - (0xff < uVar345);
      auVar311[0xf] = cVar5;
      uVar320 = (ushort)bVar19;
      uVar332 = (ushort)((uint)uVar191 >> 0x18);
      uVar334 = (ushort)((uint6)uVar193 >> 0x28);
      uVar337 = (ushort)((ulong)uVar195 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar199._0_10_ >> 0x48);
      uVar341 = auVar199._10_2_ >> 8;
      uVar343 = auVar205._12_2_ >> 8;
      uVar345 = auVar211._14_2_ >> 8;
      uVar410 = (ushort)bVar51;
      uVar431 = (ushort)((uint)uVar190 >> 0x18);
      uVar434 = (ushort)((uint6)uVar192 >> 0x28);
      uVar437 = (ushort)((ulong)uVar194 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar393._0_10_ >> 0x48);
      uVar443 = auVar393._10_2_ >> 8;
      uVar446 = auVar398._12_2_ >> 8;
      uVar449 = auVar404._14_2_ >> 8;
      bVar3 = (uVar332 != 0) * (uVar332 < 0x100) * cVar23 - (0xff < uVar332);
      cVar17 = (uVar337 != 0) * (uVar337 < 0x100) * cVar24 - (0xff < uVar337);
      uVar190 = CONCAT13(cVar17,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar25 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar3,(uVar320 != 0) * (uVar320 < 0x100) * bVar19
                                                        - (0xff < uVar320))));
      cVar18 = (uVar341 != 0) * (uVar341 < 0x100) * cVar20 - (0xff < uVar341);
      uVar192 = CONCAT15(cVar18,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar26 -
                                         (0xff < uVar339),uVar190));
      cVar16 = (uVar345 != 0) * (uVar345 < 0x100) * cVar22 - (0xff < uVar345);
      uVar194 = CONCAT17(cVar16,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar21 -
                                         (0xff < uVar343),uVar192));
      cVar15 = (uVar431 != 0) * (uVar431 < 0x100) * cVar30 - (0xff < uVar431);
      auVar200._0_10_ =
           CONCAT19(cVar15,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar51 - (0xff < uVar410),
                                    uVar194));
      auVar200[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar32 - (0xff < uVar434);
      cVar14 = (uVar437 != 0) * (uVar437 < 0x100) * cVar34 - (0xff < uVar437);
      auVar200[0xb] = cVar14;
      auVar206[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar33 - (0xff < uVar440);
      auVar206._0_12_ = auVar200;
      cVar13 = (uVar443 != 0) * (uVar443 < 0x100) * cVar28 - (0xff < uVar443);
      auVar206[0xd] = cVar13;
      auVar212[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar29 - (0xff < uVar446);
      auVar212._0_14_ = auVar206;
      cVar12 = (uVar449 != 0) * (uVar449 < 0x100) * cVar31 - (0xff < uVar449);
      auVar212[0xf] = cVar12;
      uVar320 = (ushort)bVar27;
      uVar332 = (ushort)((uint)uVar453 >> 0x18);
      uVar334 = (ushort)((uint6)uVar454 >> 0x28);
      uVar337 = (ushort)((ulong)uVar455 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar470._0_10_ >> 0x48);
      uVar341 = auVar470._10_2_ >> 8;
      uVar343 = auVar475._12_2_ >> 8;
      uVar345 = auVar480._14_2_ >> 8;
      uVar410 = (ushort)bVar35;
      uVar431 = (ushort)((uint)uVar248 >> 0x18);
      uVar434 = (ushort)((uint6)uVar250 >> 0x28);
      uVar437 = (ushort)((ulong)uVar252 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar324._0_10_ >> 0x48);
      uVar443 = auVar324._10_2_ >> 8;
      uVar446 = auVar327._12_2_ >> 8;
      uVar449 = auVar330._14_2_ >> 8;
      bVar11 = (uVar332 != 0) * (uVar332 < 0x100) * cVar53 - (0xff < uVar332);
      cVar26 = (uVar337 != 0) * (uVar337 < 0x100) * cVar40 - (0xff < uVar337);
      uVar248 = CONCAT13(cVar26,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar52 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar11,(uVar320 != 0) * (uVar320 < 0x100) * bVar27
                                                         - (0xff < uVar320))));
      cVar25 = (uVar341 != 0) * (uVar341 < 0x100) * cVar36 - (0xff < uVar341);
      uVar250 = CONCAT15(cVar25,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar39 -
                                         (0xff < uVar339),uVar248));
      cVar24 = (uVar345 != 0) * (uVar345 < 0x100) * cVar37 - (0xff < uVar345);
      uVar252 = CONCAT17(cVar24,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar38 -
                                         (0xff < uVar343),uVar250));
      cVar23 = (uVar431 != 0) * (uVar431 < 0x100) * cVar41 - (0xff < uVar431);
      auVar258._0_10_ =
           CONCAT19(cVar23,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar35 - (0xff < uVar410),
                                    uVar252));
      auVar258[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar42 - (0xff < uVar434);
      cVar20 = (uVar437 != 0) * (uVar437 < 0x100) * cVar47 - (0xff < uVar437);
      auVar258[0xb] = cVar20;
      auVar264[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar50 - (0xff < uVar440);
      auVar264._0_12_ = auVar258;
      cVar22 = (uVar443 != 0) * (uVar443 < 0x100) * cVar49 - (0xff < uVar443);
      auVar264[0xd] = cVar22;
      auVar270[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar48 - (0xff < uVar446);
      auVar270._0_14_ = auVar264;
      cVar21 = (uVar449 != 0) * (uVar449 < 0x100) * cVar46 - (0xff < uVar449);
      auVar270[0xf] = cVar21;
      auVar303 = auVar385 & auVar462;
      auVar208 = auVar430 & auVar462;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar19 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar33 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar280 = CONCAT13(cVar33,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar19,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar34 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar281 = CONCAT15(cVar34,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar280));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar32 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar282 = CONCAT17(cVar32,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar281));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar30 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar350._0_10_ =
           CONCAT19(cVar30,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar282));
      sVar322 = auVar208._4_2_;
      auVar350[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar28 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar350[0xb] = cVar28;
      sVar322 = auVar208._8_2_;
      auVar352[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar352._0_12_ = auVar350;
      sVar322 = auVar208._10_2_;
      cVar29 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar352[0xd] = cVar29;
      sVar322 = auVar208._12_2_;
      auVar356[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar356._0_14_ = auVar352;
      sVar322 = auVar208._14_2_;
      cVar31 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar356[0xf] = cVar31;
      auVar303 = auVar241 & auVar462;
      auVar208 = auVar311 & auVar462;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar27 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar36 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar453 = CONCAT13(cVar36,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar27,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar41 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar454 = CONCAT15(cVar41,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar453));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar40 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar455 = CONCAT17(cVar40,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar454));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar42 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar457._0_10_ =
           CONCAT19(cVar42,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar455));
      sVar322 = auVar208._4_2_;
      auVar457[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar39 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar457[0xb] = cVar39;
      sVar322 = auVar208._8_2_;
      auVar459[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar459._0_12_ = auVar457;
      sVar322 = auVar208._10_2_;
      cVar38 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar459[0xd] = cVar38;
      sVar322 = auVar208._12_2_;
      auVar461[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar461._0_14_ = auVar459;
      sVar322 = auVar208._14_2_;
      cVar37 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar461[0xf] = cVar37;
      auVar303 = auVar212 & auVar462;
      auVar208 = auVar270 & auVar462;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar35 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar47 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar388 = CONCAT13(cVar47,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar35,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar50 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar389 = CONCAT15(cVar50,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar388));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar49 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar390 = CONCAT17(cVar49,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar389));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar48 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar394._0_10_ =
           CONCAT19(cVar48,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar390));
      sVar322 = auVar208._4_2_;
      auVar394[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar46 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar394[0xb] = cVar46;
      sVar322 = auVar208._8_2_;
      auVar399[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar399._0_12_ = auVar394;
      sVar322 = auVar208._10_2_;
      cVar52 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar399[0xd] = cVar52;
      sVar322 = auVar208._12_2_;
      auVar405[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar405._0_14_ = auVar399;
      sVar322 = auVar208._14_2_;
      cVar53 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar405[0xf] = cVar53;
      uVar320 = (ushort)bVar43;
      uVar332 = (ushort)((uint)uVar365 >> 0x18);
      uVar334 = (ushort)((uint6)uVar366 >> 0x28);
      uVar337 = (ushort)((ulong)uVar367 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar369._0_10_ >> 0x48);
      uVar341 = auVar369._10_2_ >> 8;
      uVar343 = auVar372._12_2_ >> 8;
      uVar345 = auVar385._14_2_ >> 8;
      uVar410 = (ushort)bVar59;
      uVar431 = (ushort)((uint)uVar413 >> 0x18);
      uVar434 = (ushort)((uint6)uVar414 >> 0x28);
      uVar437 = (ushort)((ulong)uVar415 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar420._0_10_ >> 0x48);
      uVar443 = auVar420._10_2_ >> 8;
      uVar446 = auVar425._12_2_ >> 8;
      uVar449 = auVar430._14_2_ >> 8;
      bVar51 = (uVar332 != 0) * (uVar332 < 0x100) * cVar45 - (0xff < uVar332);
      cVar45 = (uVar337 != 0) * (uVar337 < 0x100) * cVar56 - (0xff < uVar337);
      uVar365 = CONCAT13(cVar45,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar57 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar51,(uVar320 != 0) * (uVar320 < 0x100) * bVar43
                                                         - (0xff < uVar320))));
      cVar81 = (uVar341 != 0) * (uVar341 < 0x100) * cVar55 - (0xff < uVar341);
      uVar366 = CONCAT15(cVar81,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar58 -
                                         (0xff < uVar339),uVar365));
      cVar57 = (uVar345 != 0) * (uVar345 < 0x100) * cVar44 - (0xff < uVar345);
      uVar367 = CONCAT17(cVar57,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar54 -
                                         (0xff < uVar343),uVar366));
      cVar56 = (uVar431 != 0) * (uVar431 < 0x100) * cVar65 - (0xff < uVar431);
      auVar370._0_10_ =
           CONCAT19(cVar56,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar59 - (0xff < uVar410),
                                    uVar367));
      auVar370[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar66 - (0xff < uVar434);
      cVar55 = (uVar437 != 0) * (uVar437 < 0x100) * cVar64 - (0xff < uVar437);
      auVar370[0xb] = cVar55;
      auVar373[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar62 - (0xff < uVar440);
      auVar373._0_12_ = auVar370;
      cVar54 = (uVar443 != 0) * (uVar443 < 0x100) * cVar63 - (0xff < uVar443);
      auVar373[0xd] = cVar54;
      auVar386[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar61 - (0xff < uVar446);
      auVar386._0_14_ = auVar373;
      cVar44 = (uVar449 != 0) * (uVar449 < 0x100) * cVar60 - (0xff < uVar449);
      auVar386[0xf] = cVar44;
      uVar320 = (ushort)bVar67;
      uVar332 = (ushort)((uint)uVar222 >> 0x18);
      uVar334 = (ushort)((uint6)uVar223 >> 0x28);
      uVar337 = (ushort)((ulong)uVar224 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar228._0_10_ >> 0x48);
      uVar341 = auVar228._10_2_ >> 8;
      uVar343 = auVar234._12_2_ >> 8;
      uVar345 = auVar241._14_2_ >> 8;
      uVar410 = (ushort)bVar75;
      uVar431 = (ushort)((uint)uVar249 >> 0x18);
      uVar434 = (ushort)((uint6)uVar251 >> 0x28);
      uVar437 = (ushort)((ulong)uVar253 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar287._0_10_ >> 0x48);
      uVar443 = auVar287._10_2_ >> 8;
      uVar446 = auVar293._12_2_ >> 8;
      uVar449 = auVar311._14_2_ >> 8;
      bVar43 = (uVar332 != 0) * (uVar332 < 0x100) * cVar68 - (0xff < uVar332);
      cVar66 = (uVar337 != 0) * (uVar337 < 0x100) * cVar73 - (0xff < uVar337);
      uVar222 = CONCAT13(cVar66,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar74 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar43,(uVar320 != 0) * (uVar320 < 0x100) * bVar67
                                                         - (0xff < uVar320))));
      cVar65 = (uVar341 != 0) * (uVar341 < 0x100) * cVar71 - (0xff < uVar341);
      uVar223 = CONCAT15(cVar65,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar72 -
                                         (0xff < uVar339),uVar222));
      cVar58 = (uVar345 != 0) * (uVar345 < 0x100) * cVar69 - (0xff < uVar345);
      uVar224 = CONCAT17(cVar58,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar70 -
                                         (0xff < uVar343),uVar223));
      cVar4 = (uVar431 != 0) * (uVar431 < 0x100) * cVar4 - (0xff < uVar431);
      auVar229._0_10_ =
           CONCAT19(cVar4,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar75 - (0xff < uVar410),
                                   uVar224));
      auVar229[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar10 - (0xff < uVar434);
      cVar8 = (uVar437 != 0) * (uVar437 < 0x100) * cVar8 - (0xff < uVar437);
      auVar229[0xb] = cVar8;
      auVar235[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar9 - (0xff < uVar440);
      auVar235._0_12_ = auVar229;
      cVar7 = (uVar443 != 0) * (uVar443 < 0x100) * cVar7 - (0xff < uVar443);
      auVar235[0xd] = cVar7;
      auVar242[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar6 - (0xff < uVar446);
      auVar242._0_14_ = auVar235;
      cVar5 = (uVar449 != 0) * (uVar449 < 0x100) * cVar5 - (0xff < uVar449);
      auVar242[0xf] = cVar5;
      uVar320 = (ushort)bVar3;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar200._0_10_ >> 0x48);
      uVar341 = auVar200._10_2_ >> 8;
      uVar343 = auVar206._12_2_ >> 8;
      uVar345 = auVar212._14_2_ >> 8;
      uVar410 = (ushort)bVar11;
      uVar431 = (ushort)((uint)uVar248 >> 0x18);
      uVar434 = (ushort)((uint6)uVar250 >> 0x28);
      uVar437 = (ushort)((ulong)uVar252 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar258._0_10_ >> 0x48);
      uVar443 = auVar258._10_2_ >> 8;
      uVar446 = auVar264._12_2_ >> 8;
      uVar449 = auVar270._14_2_ >> 8;
      bVar59 = (uVar332 != 0) * (uVar332 < 0x100) * cVar17 - (0xff < uVar332);
      cVar6 = (uVar337 != 0) * (uVar337 < 0x100) * cVar16 - (0xff < uVar337);
      uVar190 = CONCAT13(cVar6,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar18 -
                                        (0xff < uVar334),
                                        CONCAT11(bVar59,(uVar320 != 0) * (uVar320 < 0x100) * bVar3 -
                                                        (0xff < uVar320))));
      cVar9 = (uVar341 != 0) * (uVar341 < 0x100) * cVar14 - (0xff < uVar341);
      uVar192 = CONCAT15(cVar9,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar15 -
                                        (0xff < uVar339),uVar190));
      cVar10 = (uVar345 != 0) * (uVar345 < 0x100) * cVar12 - (0xff < uVar345);
      uVar194 = CONCAT17(cVar10,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar13 -
                                         (0xff < uVar343),uVar192));
      cVar17 = (uVar431 != 0) * (uVar431 < 0x100) * cVar26 - (0xff < uVar431);
      auVar201._0_10_ =
           CONCAT19(cVar17,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar11 - (0xff < uVar410),
                                    uVar194));
      auVar201[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar25 - (0xff < uVar434);
      cVar18 = (uVar437 != 0) * (uVar437 < 0x100) * cVar24 - (0xff < uVar437);
      auVar201[0xb] = cVar18;
      auVar207[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar23 - (0xff < uVar440);
      auVar207._0_12_ = auVar201;
      cVar16 = (uVar443 != 0) * (uVar443 < 0x100) * cVar20 - (0xff < uVar443);
      auVar207[0xd] = cVar16;
      auVar213[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar22 - (0xff < uVar446);
      auVar213._0_14_ = auVar207;
      cVar15 = (uVar449 != 0) * (uVar449 < 0x100) * cVar21 - (0xff < uVar449);
      auVar213[0xf] = cVar15;
      auVar208 = auVar356 & auVar462;
      auVar303 = auVar461 & auVar462;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar3 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar23 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar248 = CONCAT13(cVar23,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar3,(0 < sVar322) * (sVar322 < 0x100) *
                                                        auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar22 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar250 = CONCAT15(cVar22,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                         (0xff < sVar322),uVar248));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar21 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar252 = CONCAT17(cVar21,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                         (0xff < sVar322),uVar250));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar14 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar259._0_10_ =
           CONCAT19(cVar14,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                    (0xff < sVar322),uVar252));
      sVar322 = auVar303._4_2_;
      auVar259[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar20 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar259[0xb] = cVar20;
      sVar322 = auVar303._8_2_;
      auVar265[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar265._0_12_ = auVar259;
      sVar322 = auVar303._10_2_;
      cVar12 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar265[0xd] = cVar12;
      sVar322 = auVar303._12_2_;
      auVar271[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar271._0_14_ = auVar265;
      sVar322 = auVar303._14_2_;
      cVar13 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar271[0xf] = cVar13;
      auVar303 = auVar405 & auVar462;
      auVar208 = auVar386 & auVar462;
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      bVar11 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      sVar333 = auVar303._4_2_;
      sVar336 = auVar303._6_2_;
      cVar24 = (0 < sVar336) * (sVar336 < 0x100) * auVar303[6] - (0xff < sVar336);
      uVar249 = CONCAT13(cVar24,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar303[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar11,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar303[0] - (0xff < sVar322))));
      sVar322 = auVar303._8_2_;
      sVar333 = auVar303._10_2_;
      cVar25 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[10] - (0xff < sVar333);
      uVar251 = CONCAT15(cVar25,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar303[8] -
                                         (0xff < sVar322),uVar249));
      sVar322 = auVar303._12_2_;
      sVar333 = auVar303._14_2_;
      cVar26 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[0xe] - (0xff < sVar333);
      uVar253 = CONCAT17(cVar26,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] -
                                         (0xff < sVar322),uVar251));
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      cVar64 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      auVar325._0_10_ =
           CONCAT19(cVar64,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar208[0] -
                                    (0xff < sVar322),uVar253));
      sVar322 = auVar208._4_2_;
      auVar325[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[4] - (0xff < sVar322);
      sVar322 = auVar208._6_2_;
      cVar62 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[6] - (0xff < sVar322);
      auVar325[0xb] = cVar62;
      sVar322 = auVar208._8_2_;
      auVar328[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[8] - (0xff < sVar322);
      auVar328._0_12_ = auVar325;
      sVar322 = auVar208._10_2_;
      cVar63 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[10] - (0xff < sVar322);
      auVar328[0xd] = cVar63;
      sVar322 = auVar208._12_2_;
      auVar331[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] - (0xff < sVar322);
      auVar331._0_14_ = auVar328;
      sVar322 = auVar208._14_2_;
      cVar61 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0xe] - (0xff < sVar322);
      auVar331[0xf] = cVar61;
      auVar208 = auVar242 & auVar462;
      auVar303 = auVar213 & auVar462;
      sVar322 = auVar208._0_2_;
      sVar333 = auVar208._2_2_;
      bVar67 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[2] - (0xff < sVar333);
      sVar333 = auVar208._4_2_;
      sVar336 = auVar208._6_2_;
      cVar72 = (0 < sVar336) * (sVar336 < 0x100) * auVar208[6] - (0xff < sVar336);
      uVar191 = CONCAT13(cVar72,CONCAT12((0 < sVar333) * (sVar333 < 0x100) * auVar208[4] -
                                         (0xff < sVar333),
                                         CONCAT11(bVar67,(0 < sVar322) * (sVar322 < 0x100) *
                                                         auVar208[0] - (0xff < sVar322))));
      sVar322 = auVar208._8_2_;
      sVar333 = auVar208._10_2_;
      cVar60 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[10] - (0xff < sVar333);
      uVar193 = CONCAT15(cVar60,CONCAT14((0 < sVar322) * (sVar322 < 0x100) * auVar208[8] -
                                         (0xff < sVar322),uVar191));
      sVar322 = auVar208._12_2_;
      sVar333 = auVar208._14_2_;
      cVar71 = (0 < sVar333) * (sVar333 < 0x100) * auVar208[0xe] - (0xff < sVar333);
      uVar195 = CONCAT17(cVar71,CONCAT16((0 < sVar322) * (sVar322 < 0x100) * auVar208[0xc] -
                                         (0xff < sVar322),uVar193));
      sVar322 = auVar303._0_2_;
      sVar333 = auVar303._2_2_;
      cVar73 = (0 < sVar333) * (sVar333 < 0x100) * auVar303[2] - (0xff < sVar333);
      auVar288._0_10_ =
           CONCAT19(cVar73,CONCAT18((0 < sVar322) * (sVar322 < 0x100) * auVar303[0] -
                                    (0xff < sVar322),uVar195));
      sVar322 = auVar303._4_2_;
      auVar288[10] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[4] - (0xff < sVar322);
      sVar322 = auVar303._6_2_;
      cVar70 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[6] - (0xff < sVar322);
      auVar288[0xb] = cVar70;
      sVar322 = auVar303._8_2_;
      auVar294[0xc] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[8] - (0xff < sVar322);
      auVar294._0_12_ = auVar288;
      sVar322 = auVar303._10_2_;
      cVar69 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[10] - (0xff < sVar322);
      auVar294[0xd] = cVar69;
      sVar322 = auVar303._12_2_;
      auVar312[0xe] = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xc] - (0xff < sVar322);
      auVar312._0_14_ = auVar294;
      sVar322 = auVar303._14_2_;
      cVar68 = (0 < sVar322) * (sVar322 < 0x100) * auVar303[0xe] - (0xff < sVar322);
      auVar312[0xf] = cVar68;
      uVar320 = (ushort)bVar19;
      uVar332 = (ushort)((uint)uVar280 >> 0x18);
      uVar334 = (ushort)((uint6)uVar281 >> 0x28);
      uVar337 = (ushort)((ulong)uVar282 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar350._0_10_ >> 0x48);
      uVar341 = auVar350._10_2_ >> 8;
      uVar343 = auVar352._12_2_ >> 8;
      uVar345 = auVar356._14_2_ >> 8;
      uVar410 = (ushort)bVar27;
      uVar431 = (ushort)((uint)uVar453 >> 0x18);
      uVar434 = (ushort)((uint6)uVar454 >> 0x28);
      uVar437 = (ushort)((ulong)uVar455 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar457._0_10_ >> 0x48);
      uVar443 = auVar457._10_2_ >> 8;
      uVar446 = auVar459._12_2_ >> 8;
      uVar449 = auVar461._14_2_ >> 8;
      bVar75 = (uVar332 != 0) * (uVar332 < 0x100) * cVar33 - (0xff < uVar332);
      cVar33 = (uVar337 != 0) * (uVar337 < 0x100) * cVar32 - (0xff < uVar337);
      uVar280 = CONCAT13(cVar33,CONCAT12((uVar334 != 0) * (uVar334 < 0x100) * cVar34 -
                                         (0xff < uVar334),
                                         CONCAT11(bVar75,(uVar320 != 0) * (uVar320 < 0x100) * bVar19
                                                         - (0xff < uVar320))));
      cVar34 = (uVar341 != 0) * (uVar341 < 0x100) * cVar28 - (0xff < uVar341);
      uVar281 = CONCAT15(cVar34,CONCAT14((uVar339 != 0) * (uVar339 < 0x100) * cVar30 -
                                         (0xff < uVar339),uVar280));
      cVar32 = (uVar345 != 0) * (uVar345 < 0x100) * cVar31 - (0xff < uVar345);
      uVar282 = CONCAT17(cVar32,CONCAT16((uVar343 != 0) * (uVar343 < 0x100) * cVar29 -
                                         (0xff < uVar343),uVar281));
      cVar30 = (uVar431 != 0) * (uVar431 < 0x100) * cVar36 - (0xff < uVar431);
      auVar351._0_10_ =
           CONCAT19(cVar30,CONCAT18((uVar410 != 0) * (uVar410 < 0x100) * bVar27 - (0xff < uVar410),
                                    uVar282));
      auVar351[10] = (uVar434 != 0) * (uVar434 < 0x100) * cVar41 - (0xff < uVar434);
      cVar28 = (uVar437 != 0) * (uVar437 < 0x100) * cVar40 - (0xff < uVar437);
      auVar351[0xb] = cVar28;
      auVar353[0xc] = (uVar440 != 0) * (uVar440 < 0x100) * cVar42 - (0xff < uVar440);
      auVar353._0_12_ = auVar351;
      cVar29 = (uVar443 != 0) * (uVar443 < 0x100) * cVar39 - (0xff < uVar443);
      auVar353[0xd] = cVar29;
      auVar357[0xe] = (uVar446 != 0) * (uVar446 < 0x100) * cVar38 - (0xff < uVar446);
      auVar357._0_14_ = auVar353;
      cVar31 = (uVar449 != 0) * (uVar449 < 0x100) * cVar37 - (0xff < uVar449);
      auVar357[0xf] = cVar31;
      uVar410 = (ushort)bVar35;
      uVar431 = (ushort)((uint)uVar388 >> 0x18);
      uVar434 = (ushort)((uint6)uVar389 >> 0x28);
      uVar437 = (ushort)((ulong)uVar390 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar394._0_10_ >> 0x48);
      uVar443 = auVar394._10_2_ >> 8;
      uVar446 = auVar399._12_2_ >> 8;
      uVar449 = auVar405._14_2_ >> 8;
      uVar320 = (ushort)bVar51;
      uVar332 = (ushort)((uint)uVar365 >> 0x18);
      uVar334 = (ushort)((uint6)uVar366 >> 0x28);
      uVar337 = (ushort)((ulong)uVar367 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar370._0_10_ >> 0x48);
      uVar341 = auVar370._10_2_ >> 8;
      uVar343 = auVar373._12_2_ >> 8;
      uVar345 = auVar386._14_2_ >> 8;
      bVar19 = (uVar431 != 0) * (uVar431 < 0x100) * cVar47 - (0xff < uVar431);
      cVar42 = (uVar437 != 0) * (uVar437 < 0x100) * cVar49 - (0xff < uVar437);
      uVar365 = CONCAT13(cVar42,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar50 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar19,(uVar410 != 0) * (uVar410 < 0x100) * bVar35
                                                         - (0xff < uVar410))));
      cVar41 = (uVar443 != 0) * (uVar443 < 0x100) * cVar46 - (0xff < uVar443);
      uVar366 = CONCAT15(cVar41,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar48 -
                                         (0xff < uVar440),uVar365));
      cVar36 = (uVar449 != 0) * (uVar449 < 0x100) * cVar53 - (0xff < uVar449);
      uVar367 = CONCAT17(cVar36,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar52 -
                                         (0xff < uVar446),uVar366));
      cVar40 = (uVar332 != 0) * (uVar332 < 0x100) * cVar45 - (0xff < uVar332);
      auVar395._0_10_ =
           CONCAT19(cVar40,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar51 - (0xff < uVar320),
                                    uVar367));
      auVar395[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar81 - (0xff < uVar334);
      cVar39 = (uVar337 != 0) * (uVar337 < 0x100) * cVar57 - (0xff < uVar337);
      auVar395[0xb] = cVar39;
      auVar400[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar56 - (0xff < uVar339);
      auVar400._0_12_ = auVar395;
      cVar38 = (uVar341 != 0) * (uVar341 < 0x100) * cVar55 - (0xff < uVar341);
      auVar400[0xd] = cVar38;
      auVar406[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar54 - (0xff < uVar343);
      auVar406._0_14_ = auVar400;
      cVar37 = (uVar345 != 0) * (uVar345 < 0x100) * cVar44 - (0xff < uVar345);
      auVar406[0xf] = cVar37;
      uVar410 = (ushort)bVar43;
      uVar431 = (ushort)((uint)uVar222 >> 0x18);
      uVar434 = (ushort)((uint6)uVar223 >> 0x28);
      uVar437 = (ushort)((ulong)uVar224 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar229._0_10_ >> 0x48);
      uVar443 = auVar229._10_2_ >> 8;
      uVar446 = auVar235._12_2_ >> 8;
      uVar449 = auVar242._14_2_ >> 8;
      uVar320 = (ushort)bVar59;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar201._0_10_ >> 0x48);
      uVar341 = auVar201._10_2_ >> 8;
      uVar343 = auVar207._12_2_ >> 8;
      uVar345 = auVar213._14_2_ >> 8;
      bVar27 = (uVar431 != 0) * (uVar431 < 0x100) * cVar66 - (0xff < uVar431);
      cVar47 = (uVar437 != 0) * (uVar437 < 0x100) * cVar58 - (0xff < uVar437);
      uVar190 = CONCAT13(cVar47,CONCAT12((uVar434 != 0) * (uVar434 < 0x100) * cVar65 -
                                         (0xff < uVar434),
                                         CONCAT11(bVar27,(uVar410 != 0) * (uVar410 < 0x100) * bVar43
                                                         - (0xff < uVar410))));
      cVar8 = (uVar443 != 0) * (uVar443 < 0x100) * cVar8 - (0xff < uVar443);
      uVar192 = CONCAT15(cVar8,CONCAT14((uVar440 != 0) * (uVar440 < 0x100) * cVar4 -
                                        (0xff < uVar440),uVar190));
      cVar5 = (uVar449 != 0) * (uVar449 < 0x100) * cVar5 - (0xff < uVar449);
      uVar194 = CONCAT17(cVar5,CONCAT16((uVar446 != 0) * (uVar446 < 0x100) * cVar7 -
                                        (0xff < uVar446),uVar192));
      cVar6 = (uVar332 != 0) * (uVar332 < 0x100) * cVar6 - (0xff < uVar332);
      auVar230._0_10_ =
           CONCAT19(cVar6,CONCAT18((uVar320 != 0) * (uVar320 < 0x100) * bVar59 - (0xff < uVar320),
                                   uVar194));
      auVar230[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar9 - (0xff < uVar334);
      cVar7 = (uVar337 != 0) * (uVar337 < 0x100) * cVar10 - (0xff < uVar337);
      auVar230[0xb] = cVar7;
      auVar236[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar17 - (0xff < uVar339);
      auVar236._0_12_ = auVar230;
      cVar9 = (uVar341 != 0) * (uVar341 < 0x100) * cVar18 - (0xff < uVar341);
      auVar236[0xd] = cVar9;
      auVar243[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar16 - (0xff < uVar343);
      auVar243._0_14_ = auVar236;
      cVar10 = (uVar345 != 0) * (uVar345 < 0x100) * cVar15 - (0xff < uVar345);
      auVar243[0xf] = cVar10;
      auVar208 = auVar271 & auVar462;
      auVar303 = auVar331 & auVar462;
      sVar322 = auVar208._0_2_;
      sVar336 = auVar208._2_2_;
      sVar216 = auVar208._4_2_;
      sVar220 = auVar208._6_2_;
      sVar349 = auVar208._8_2_;
      sVar272 = auVar208._10_2_;
      sVar274 = auVar208._12_2_;
      sVar276 = auVar208._14_2_;
      sVar278 = auVar303._0_2_;
      sVar342 = auVar303._2_2_;
      sVar464 = auVar303._4_2_;
      sVar483 = auVar303._6_2_;
      sVar537 = auVar303._8_2_;
      sVar358 = auVar303._10_2_;
      sVar543 = auVar303._12_2_;
      sVar362 = auVar303._14_2_;
      auVar355 = auVar312 & auVar462;
      auVar382 = auVar357 & auVar462;
      sVar333 = auVar355._0_2_;
      sVar214 = auVar355._2_2_;
      in_XMM6[1] = (0 < sVar214) * (sVar214 < 0x100) * auVar355[2] - (0xff < sVar214);
      in_XMM6[0] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[0] - (0xff < sVar333);
      sVar333 = auVar355._4_2_;
      in_XMM6[2] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[4] - (0xff < sVar333);
      sVar333 = auVar355._6_2_;
      in_XMM6[3] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[6] - (0xff < sVar333);
      sVar333 = auVar355._8_2_;
      in_XMM6[4] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[8] - (0xff < sVar333);
      sVar333 = auVar355._10_2_;
      in_XMM6[5] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[10] - (0xff < sVar333);
      sVar333 = auVar355._12_2_;
      in_XMM6[6] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[0xc] - (0xff < sVar333);
      sVar333 = auVar355._14_2_;
      in_XMM6[7] = (0 < sVar333) * (sVar333 < 0x100) * auVar355[0xe] - (0xff < sVar333);
      sVar333 = auVar382._0_2_;
      in_XMM6[8] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[0] - (0xff < sVar333);
      sVar333 = auVar382._2_2_;
      in_XMM6[9] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[2] - (0xff < sVar333);
      sVar333 = auVar382._4_2_;
      in_XMM6[10] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[4] - (0xff < sVar333);
      sVar333 = auVar382._6_2_;
      in_XMM6[0xb] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[6] - (0xff < sVar333);
      sVar333 = auVar382._8_2_;
      in_XMM6[0xc] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[8] - (0xff < sVar333);
      sVar333 = auVar382._10_2_;
      in_XMM6[0xd] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[10] - (0xff < sVar333);
      sVar333 = auVar382._12_2_;
      in_XMM6[0xe] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[0xc] - (0xff < sVar333);
      sVar333 = auVar382._14_2_;
      in_XMM6[0xf] = (0 < sVar333) * (sVar333 < 0x100) * auVar382[0xe] - (0xff < sVar333);
      auVar355 = auVar406 & auVar462;
      auVar462 = auVar243 & auVar462;
      sVar333 = auVar355._0_2_;
      sVar214 = auVar355._2_2_;
      sVar218 = auVar355._4_2_;
      sVar347 = auVar355._6_2_;
      sVar247 = auVar355._8_2_;
      sVar273 = auVar355._10_2_;
      sVar275 = auVar355._12_2_;
      sVar277 = auVar355._14_2_;
      sVar338 = auVar462._0_2_;
      sVar346 = auVar462._2_2_;
      sVar481 = auVar462._4_2_;
      sVar485 = auVar462._6_2_;
      sVar539 = auVar462._8_2_;
      sVar541 = auVar462._10_2_;
      sVar360 = auVar462._12_2_;
      sVar364 = auVar462._14_2_;
      uVar410 = (ushort)bVar3;
      uVar431 = (ushort)((uint)uVar248 >> 0x18);
      uVar434 = (ushort)((uint6)uVar250 >> 0x28);
      uVar437 = (ushort)((ulong)uVar252 >> 0x38);
      uVar440 = (ushort)((unkuint10)auVar259._0_10_ >> 0x48);
      uVar443 = auVar259._10_2_ >> 8;
      uVar446 = auVar265._12_2_ >> 8;
      uVar449 = auVar271._14_2_ >> 8;
      uVar279 = (ushort)bVar11;
      uVar313 = (ushort)((uint)uVar249 >> 0x18);
      uVar314 = (ushort)((uint6)uVar251 >> 0x28);
      uVar315 = (ushort)((ulong)uVar253 >> 0x38);
      uVar316 = (ushort)((unkuint10)auVar325._0_10_ >> 0x48);
      uVar317 = auVar325._10_2_ >> 8;
      uVar318 = auVar328._12_2_ >> 8;
      uVar319 = auVar331._14_2_ >> 8;
      uVar320 = (ushort)bVar67;
      uVar332 = (ushort)((uint)uVar191 >> 0x18);
      uVar334 = (ushort)((uint6)uVar193 >> 0x28);
      uVar337 = (ushort)((ulong)uVar195 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar288._0_10_ >> 0x48);
      uVar341 = auVar288._10_2_ >> 8;
      uVar343 = auVar294._12_2_ >> 8;
      uVar345 = auVar312._14_2_ >> 8;
      uVar412 = (ushort)bVar75;
      uVar433 = (ushort)((uint)uVar280 >> 0x18);
      uVar436 = (ushort)((uint6)uVar281 >> 0x28);
      uVar439 = (ushort)((ulong)uVar282 >> 0x38);
      uVar442 = (ushort)((unkuint10)auVar351._0_10_ >> 0x48);
      uVar445 = auVar351._10_2_ >> 8;
      uVar448 = auVar353._12_2_ >> 8;
      uVar451 = auVar357._14_2_ >> 8;
      in_XMM3[1] = (uVar332 != 0) * (uVar332 < 0x100) * cVar72 - (0xff < uVar332);
      in_XMM3[0] = (uVar320 != 0) * (uVar320 < 0x100) * bVar67 - (0xff < uVar320);
      in_XMM3[2] = (uVar334 != 0) * (uVar334 < 0x100) * cVar60 - (0xff < uVar334);
      in_XMM3[3] = (uVar337 != 0) * (uVar337 < 0x100) * cVar71 - (0xff < uVar337);
      in_XMM3[4] = (uVar339 != 0) * (uVar339 < 0x100) * cVar73 - (0xff < uVar339);
      in_XMM3[5] = (uVar341 != 0) * (uVar341 < 0x100) * cVar70 - (0xff < uVar341);
      in_XMM3[6] = (uVar343 != 0) * (uVar343 < 0x100) * cVar69 - (0xff < uVar343);
      in_XMM3[7] = (uVar345 != 0) * (uVar345 < 0x100) * cVar68 - (0xff < uVar345);
      in_XMM3[8] = (uVar412 != 0) * (uVar412 < 0x100) * bVar75 - (0xff < uVar412);
      in_XMM3[9] = (uVar433 != 0) * (uVar433 < 0x100) * cVar33 - (0xff < uVar433);
      in_XMM3[10] = (uVar436 != 0) * (uVar436 < 0x100) * cVar34 - (0xff < uVar436);
      in_XMM3[0xb] = (uVar439 != 0) * (uVar439 < 0x100) * cVar32 - (0xff < uVar439);
      in_XMM3[0xc] = (uVar442 != 0) * (uVar442 < 0x100) * cVar30 - (0xff < uVar442);
      in_XMM3[0xd] = (uVar445 != 0) * (uVar445 < 0x100) * cVar28 - (0xff < uVar445);
      in_XMM3[0xe] = (uVar448 != 0) * (uVar448 < 0x100) * cVar29 - (0xff < uVar448);
      in_XMM3[0xf] = (uVar451 != 0) * (uVar451 < 0x100) * cVar31 - (0xff < uVar451);
      uVar412 = (ushort)bVar19;
      uVar433 = (ushort)((uint)uVar365 >> 0x18);
      uVar436 = (ushort)((uint6)uVar366 >> 0x28);
      uVar439 = (ushort)((ulong)uVar367 >> 0x38);
      uVar442 = (ushort)((unkuint10)auVar395._0_10_ >> 0x48);
      uVar445 = auVar395._10_2_ >> 8;
      uVar448 = auVar400._12_2_ >> 8;
      uVar451 = auVar406._14_2_ >> 8;
      uVar320 = (ushort)bVar27;
      uVar332 = (ushort)((uint)uVar190 >> 0x18);
      uVar334 = (ushort)((uint6)uVar192 >> 0x28);
      uVar337 = (ushort)((ulong)uVar194 >> 0x38);
      uVar339 = (ushort)((unkuint10)auVar230._0_10_ >> 0x48);
      uVar341 = auVar230._10_2_ >> 8;
      uVar343 = auVar236._12_2_ >> 8;
      uVar345 = auVar243._14_2_ >> 8;
      puVar1 = puVar183 + RGB_stride;
      *puVar1 = (0 < sVar322) * (sVar322 < 0x100) * auVar208[0] - (0xff < sVar322);
      puVar1[1] = (0 < sVar336) * (sVar336 < 0x100) * auVar208[2] - (0xff < sVar336);
      puVar1[2] = (0 < sVar216) * (sVar216 < 0x100) * auVar208[4] - (0xff < sVar216);
      puVar1[3] = (0 < sVar220) * (sVar220 < 0x100) * auVar208[6] - (0xff < sVar220);
      puVar1[4] = (0 < sVar349) * (sVar349 < 0x100) * auVar208[8] - (0xff < sVar349);
      puVar1[5] = (0 < sVar272) * (sVar272 < 0x100) * auVar208[10] - (0xff < sVar272);
      puVar1[6] = (0 < sVar274) * (sVar274 < 0x100) * auVar208[0xc] - (0xff < sVar274);
      puVar1[7] = (0 < sVar276) * (sVar276 < 0x100) * auVar208[0xe] - (0xff < sVar276);
      puVar1[8] = (0 < sVar278) * (sVar278 < 0x100) * auVar303[0] - (0xff < sVar278);
      puVar1[9] = (0 < sVar342) * (sVar342 < 0x100) * auVar303[2] - (0xff < sVar342);
      puVar1[10] = (0 < sVar464) * (sVar464 < 0x100) * auVar303[4] - (0xff < sVar464);
      puVar1[0xb] = (0 < sVar483) * (sVar483 < 0x100) * auVar303[6] - (0xff < sVar483);
      puVar1[0xc] = (0 < sVar537) * (sVar537 < 0x100) * auVar303[8] - (0xff < sVar537);
      puVar1[0xd] = (0 < sVar358) * (sVar358 < 0x100) * auVar303[10] - (0xff < sVar358);
      puVar1[0xe] = (0 < sVar543) * (sVar543 < 0x100) * auVar303[0xc] - (0xff < sVar543);
      puVar1[0xf] = (0 < sVar362) * (sVar362 < 0x100) * auVar303[0xe] - (0xff < sVar362);
      *(undefined1 (*) [16])(puVar183 + (ulong)RGB_stride + 0x10) = in_XMM6;
      puVar1 = puVar183 + (ulong)RGB_stride + 0x20;
      *puVar1 = (0 < sVar333) * (sVar333 < 0x100) * auVar355[0] - (0xff < sVar333);
      puVar1[1] = (0 < sVar214) * (sVar214 < 0x100) * auVar355[2] - (0xff < sVar214);
      puVar1[2] = (0 < sVar218) * (sVar218 < 0x100) * auVar355[4] - (0xff < sVar218);
      puVar1[3] = (0 < sVar347) * (sVar347 < 0x100) * auVar355[6] - (0xff < sVar347);
      puVar1[4] = (0 < sVar247) * (sVar247 < 0x100) * auVar355[8] - (0xff < sVar247);
      puVar1[5] = (0 < sVar273) * (sVar273 < 0x100) * auVar355[10] - (0xff < sVar273);
      puVar1[6] = (0 < sVar275) * (sVar275 < 0x100) * auVar355[0xc] - (0xff < sVar275);
      puVar1[7] = (0 < sVar277) * (sVar277 < 0x100) * auVar355[0xe] - (0xff < sVar277);
      puVar1[8] = (0 < sVar338) * (sVar338 < 0x100) * auVar462[0] - (0xff < sVar338);
      puVar1[9] = (0 < sVar346) * (sVar346 < 0x100) * auVar462[2] - (0xff < sVar346);
      puVar1[10] = (0 < sVar481) * (sVar481 < 0x100) * auVar462[4] - (0xff < sVar481);
      puVar1[0xb] = (0 < sVar485) * (sVar485 < 0x100) * auVar462[6] - (0xff < sVar485);
      puVar1[0xc] = (0 < sVar539) * (sVar539 < 0x100) * auVar462[8] - (0xff < sVar539);
      puVar1[0xd] = (0 < sVar541) * (sVar541 < 0x100) * auVar462[10] - (0xff < sVar541);
      puVar1[0xe] = (0 < sVar360) * (sVar360 < 0x100) * auVar462[0xc] - (0xff < sVar360);
      puVar1[0xf] = (0 < sVar364) * (sVar364 < 0x100) * auVar462[0xe] - (0xff < sVar364);
      puVar1 = puVar183 + (ulong)RGB_stride + 0x30;
      *puVar1 = (uVar410 != 0) * (uVar410 < 0x100) * bVar3 - (0xff < uVar410);
      puVar1[1] = (uVar431 != 0) * (uVar431 < 0x100) * cVar23 - (0xff < uVar431);
      puVar1[2] = (uVar434 != 0) * (uVar434 < 0x100) * cVar22 - (0xff < uVar434);
      puVar1[3] = (uVar437 != 0) * (uVar437 < 0x100) * cVar21 - (0xff < uVar437);
      puVar1[4] = (uVar440 != 0) * (uVar440 < 0x100) * cVar14 - (0xff < uVar440);
      puVar1[5] = (uVar443 != 0) * (uVar443 < 0x100) * cVar20 - (0xff < uVar443);
      puVar1[6] = (uVar446 != 0) * (uVar446 < 0x100) * cVar12 - (0xff < uVar446);
      puVar1[7] = (uVar449 != 0) * (uVar449 < 0x100) * cVar13 - (0xff < uVar449);
      puVar1[8] = (uVar279 != 0) * (uVar279 < 0x100) * bVar11 - (0xff < uVar279);
      puVar1[9] = (uVar313 != 0) * (uVar313 < 0x100) * cVar24 - (0xff < uVar313);
      puVar1[10] = (uVar314 != 0) * (uVar314 < 0x100) * cVar25 - (0xff < uVar314);
      puVar1[0xb] = (uVar315 != 0) * (uVar315 < 0x100) * cVar26 - (0xff < uVar315);
      puVar1[0xc] = (uVar316 != 0) * (uVar316 < 0x100) * cVar64 - (0xff < uVar316);
      puVar1[0xd] = (uVar317 != 0) * (uVar317 < 0x100) * cVar62 - (0xff < uVar317);
      puVar1[0xe] = (uVar318 != 0) * (uVar318 < 0x100) * cVar63 - (0xff < uVar318);
      puVar1[0xf] = (uVar319 != 0) * (uVar319 < 0x100) * cVar61 - (0xff < uVar319);
      *(undefined1 (*) [16])(puVar183 + (ulong)RGB_stride + 0x40) = in_XMM3;
      puVar1 = puVar183 + (ulong)RGB_stride + 0x50;
      *puVar1 = (uVar412 != 0) * (uVar412 < 0x100) * bVar19 - (0xff < uVar412);
      puVar1[1] = (uVar433 != 0) * (uVar433 < 0x100) * cVar42 - (0xff < uVar433);
      puVar1[2] = (uVar436 != 0) * (uVar436 < 0x100) * cVar41 - (0xff < uVar436);
      puVar1[3] = (uVar439 != 0) * (uVar439 < 0x100) * cVar36 - (0xff < uVar439);
      puVar1[4] = (uVar442 != 0) * (uVar442 < 0x100) * cVar40 - (0xff < uVar442);
      puVar1[5] = (uVar445 != 0) * (uVar445 < 0x100) * cVar39 - (0xff < uVar445);
      puVar1[6] = (uVar448 != 0) * (uVar448 < 0x100) * cVar38 - (0xff < uVar448);
      puVar1[7] = (uVar451 != 0) * (uVar451 < 0x100) * cVar37 - (0xff < uVar451);
      puVar1[8] = (uVar320 != 0) * (uVar320 < 0x100) * bVar27 - (0xff < uVar320);
      puVar1[9] = (uVar332 != 0) * (uVar332 < 0x100) * cVar47 - (0xff < uVar332);
      puVar1[10] = (uVar334 != 0) * (uVar334 < 0x100) * cVar8 - (0xff < uVar334);
      puVar1[0xb] = (uVar337 != 0) * (uVar337 < 0x100) * cVar5 - (0xff < uVar337);
      puVar1[0xc] = (uVar339 != 0) * (uVar339 < 0x100) * cVar6 - (0xff < uVar339);
      puVar1[0xd] = (uVar341 != 0) * (uVar341 < 0x100) * cVar7 - (0xff < uVar341);
      puVar1[0xe] = (uVar343 != 0) * (uVar343 < 0x100) * cVar9 - (0xff < uVar343);
      puVar1[0xf] = (uVar345 != 0) * (uVar345 < 0x100) * cVar10 - (0xff < uVar345);
      puVar183 = puVar183 + 0x60;
      uVar185 = uVar185 + 0x10;
    }
    RGB_stride = RGB_stride + iVar127;
    uVar186 = uVar186 + iVar127;
    Y_stride = Y_stride + iVar126;
    uVar188 = (ulong)(uint)((int)uVar188 + iVar126);
  }
  return;
}

Assistant:

void yuv420_rgb24_sseu(
	uint32_t width, uint32_t height, 
	const uint8_t *Y, const uint8_t *U, const uint8_t *V, uint32_t Y_stride, uint32_t UV_stride, 
	uint8_t *RGB, uint32_t RGB_stride, 
	YCbCrType yuv_type)
{
	#define LOAD_SI128 _mm_loadu_si128
	#define SAVE_SI128 _mm_storeu_si128
	const YUV2RGBParam *const param = &(YUV2RGB[yuv_type]);
	
	uint32_t x, y;
	for(y=0; y<(height-1); y+=2)
	{
		const uint8_t *y_ptr1=Y+y*Y_stride,
			*y_ptr2=Y+(y+1)*Y_stride,
			*u_ptr=U+(y/2)*UV_stride,
			*v_ptr=V+(y/2)*UV_stride;
		
		uint8_t *rgb_ptr1=RGB+y*RGB_stride,
			*rgb_ptr2=RGB+(y+1)*RGB_stride;
		
		for(x=0; x<(width-31); x+=32)
		{
			YUV2RGB_32_PLANAR
			
			y_ptr1+=32;
			y_ptr2+=32;
			u_ptr+=16; 
			v_ptr+=16;
			rgb_ptr1+=96;
			rgb_ptr2+=96;
		}
	}
	#undef LOAD_SI128
	#undef SAVE_SI128
}